

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [28];
  undefined1 auVar28 [28];
  undefined1 auVar29 [28];
  undefined1 auVar30 [28];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  byte bVar38;
  uint uVar39;
  ulong uVar40;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined8 in_R11;
  ulong uVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar58 [16];
  undefined1 auVar86 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float t1;
  float fVar128;
  undefined4 uVar129;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vfloat4 a0_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vfloat4 b0;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  vfloat4 a0_3;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  __m128 a_1;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  __m128 a;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar217;
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar229;
  float fVar230;
  vfloat4 a0_1;
  float fVar231;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar232;
  float fVar238;
  float fVar239;
  vfloat4 a0;
  undefined1 auVar233 [16];
  float fVar240;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_468;
  RTCFilterFunctionNArguments local_460;
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar41;
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  uint uVar118;
  undefined1 auVar244 [32];
  
  uVar40 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar40 * 0x19 + 0x12);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar58 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar52 = vsubps_avx(auVar50,*(undefined1 (*) [16])(prim + uVar40 * 0x19 + 6));
  fVar142 = fVar1 * auVar52._0_4_;
  fVar119 = fVar1 * auVar58._0_4_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar40 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar50);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar40 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar54);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar40 * 6 + 6);
  auVar82 = vpmovsxbd_avx2(auVar5);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar40 * 0xb + 6);
  auVar96 = vpmovsxbd_avx2(auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar40 * 0xc + 6);
  auVar97 = vpmovsxbd_avx2(auVar60);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar40 * 0xd + 6);
  auVar83 = vpmovsxbd_avx2(auVar56);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar40 * 0x12 + 6);
  auVar88 = vpmovsxbd_avx2(auVar57);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar40 * 0x13 + 6);
  auVar91 = vpmovsxbd_avx2(auVar51);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar91);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar40 * 0x14 + 6);
  auVar78 = vpmovsxbd_avx2(auVar55);
  auVar90 = vcvtdq2ps_avx(auVar78);
  auVar162._4_4_ = fVar119;
  auVar162._0_4_ = fVar119;
  auVar162._8_4_ = fVar119;
  auVar162._12_4_ = fVar119;
  auVar162._16_4_ = fVar119;
  auVar162._20_4_ = fVar119;
  auVar162._24_4_ = fVar119;
  auVar162._28_4_ = fVar119;
  auVar251._8_4_ = 1;
  auVar251._0_8_ = 0x100000001;
  auVar251._12_4_ = 1;
  auVar251._16_4_ = 1;
  auVar251._20_4_ = 1;
  auVar251._24_4_ = 1;
  auVar251._28_4_ = 1;
  auVar92 = ZEXT1632(CONCAT412(fVar1 * auVar58._12_4_,
                               CONCAT48(fVar1 * auVar58._8_4_,
                                        CONCAT44(fVar1 * auVar58._4_4_,fVar119))));
  auVar79 = vpermps_avx2(auVar251,auVar92);
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar260 = ZEXT3264(auVar76);
  auVar77 = vpermps_avx512vl(auVar76,auVar92);
  fVar119 = auVar77._0_4_;
  fVar208 = auVar77._4_4_;
  auVar92._4_4_ = fVar208 * auVar82._4_4_;
  auVar92._0_4_ = fVar119 * auVar82._0_4_;
  fVar217 = auVar77._8_4_;
  auVar92._8_4_ = fVar217 * auVar82._8_4_;
  fVar218 = auVar77._12_4_;
  auVar92._12_4_ = fVar218 * auVar82._12_4_;
  fVar125 = auVar77._16_4_;
  auVar92._16_4_ = fVar125 * auVar82._16_4_;
  fVar126 = auVar77._20_4_;
  auVar92._20_4_ = fVar126 * auVar82._20_4_;
  fVar127 = auVar77._24_4_;
  auVar92._24_4_ = fVar127 * auVar82._24_4_;
  auVar92._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar83._4_4_ * fVar208;
  auVar91._0_4_ = auVar83._0_4_ * fVar119;
  auVar91._8_4_ = auVar83._8_4_ * fVar217;
  auVar91._12_4_ = auVar83._12_4_ * fVar218;
  auVar91._16_4_ = auVar83._16_4_ * fVar125;
  auVar91._20_4_ = auVar83._20_4_ * fVar126;
  auVar91._24_4_ = auVar83._24_4_ * fVar127;
  auVar91._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar90._4_4_ * fVar208;
  auVar78._0_4_ = auVar90._0_4_ * fVar119;
  auVar78._8_4_ = auVar90._8_4_ * fVar217;
  auVar78._12_4_ = auVar90._12_4_ * fVar218;
  auVar78._16_4_ = auVar90._16_4_ * fVar125;
  auVar78._20_4_ = auVar90._20_4_ * fVar126;
  auVar78._24_4_ = auVar90._24_4_ * fVar127;
  auVar78._28_4_ = auVar77._28_4_;
  auVar50 = vfmadd231ps_fma(auVar92,auVar79,auVar80);
  auVar54 = vfmadd231ps_fma(auVar91,auVar79,auVar97);
  auVar5 = vfmadd231ps_fma(auVar78,auVar89,auVar79);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar162,auVar81);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar162,auVar96);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar88,auVar162);
  auVar237._4_4_ = fVar142;
  auVar237._0_4_ = fVar142;
  auVar237._8_4_ = fVar142;
  auVar237._12_4_ = fVar142;
  auVar237._16_4_ = fVar142;
  auVar237._20_4_ = fVar142;
  auVar237._24_4_ = fVar142;
  auVar237._28_4_ = fVar142;
  auVar78 = ZEXT1632(CONCAT412(fVar1 * auVar52._12_4_,
                               CONCAT48(fVar1 * auVar52._8_4_,
                                        CONCAT44(fVar1 * auVar52._4_4_,fVar142))));
  auVar91 = vpermps_avx2(auVar251,auVar78);
  auVar78 = vpermps_avx512vl(auVar76,auVar78);
  auVar79 = vmulps_avx512vl(auVar78,auVar82);
  auVar95._0_4_ = auVar78._0_4_ * auVar83._0_4_;
  auVar95._4_4_ = auVar78._4_4_ * auVar83._4_4_;
  auVar95._8_4_ = auVar78._8_4_ * auVar83._8_4_;
  auVar95._12_4_ = auVar78._12_4_ * auVar83._12_4_;
  auVar95._16_4_ = auVar78._16_4_ * auVar83._16_4_;
  auVar95._20_4_ = auVar78._20_4_ * auVar83._20_4_;
  auVar95._24_4_ = auVar78._24_4_ * auVar83._24_4_;
  auVar95._28_4_ = 0;
  auVar83._4_4_ = auVar78._4_4_ * auVar90._4_4_;
  auVar83._0_4_ = auVar78._0_4_ * auVar90._0_4_;
  auVar83._8_4_ = auVar78._8_4_ * auVar90._8_4_;
  auVar83._12_4_ = auVar78._12_4_ * auVar90._12_4_;
  auVar83._16_4_ = auVar78._16_4_ * auVar90._16_4_;
  auVar83._20_4_ = auVar78._20_4_ * auVar90._20_4_;
  auVar83._24_4_ = auVar78._24_4_ * auVar90._24_4_;
  auVar83._28_4_ = auVar82._28_4_;
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar80);
  auVar59 = vfmadd231ps_fma(auVar95,auVar91,auVar97);
  auVar60 = vfmadd231ps_fma(auVar83,auVar91,auVar89);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar237,auVar81);
  auVar252 = ZEXT3264(auVar80);
  auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar237,auVar96);
  auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar237,auVar88);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar81 = vandps_avx(ZEXT1632(auVar50),auVar99);
  auVar153._8_4_ = 0x219392ef;
  auVar153._0_8_ = 0x219392ef219392ef;
  auVar153._12_4_ = 0x219392ef;
  auVar153._16_4_ = 0x219392ef;
  auVar153._20_4_ = 0x219392ef;
  auVar153._24_4_ = 0x219392ef;
  auVar153._28_4_ = 0x219392ef;
  uVar45 = vcmpps_avx512vl(auVar81,auVar153,1);
  bVar48 = (bool)((byte)uVar45 & 1);
  auVar79._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._0_4_;
  bVar48 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._4_4_;
  bVar48 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._8_4_;
  bVar48 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar45 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar54),auVar99);
  uVar45 = vcmpps_avx512vl(auVar81,auVar153,1);
  bVar48 = (bool)((byte)uVar45 & 1);
  auVar76._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._0_4_;
  bVar48 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._4_4_;
  bVar48 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._8_4_;
  bVar48 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._12_4_;
  auVar76._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * 0x219392ef;
  auVar76._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * 0x219392ef;
  auVar76._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * 0x219392ef;
  auVar76._28_4_ = (uint)(byte)(uVar45 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar5),auVar99);
  uVar45 = vcmpps_avx512vl(auVar81,auVar153,1);
  bVar48 = (bool)((byte)uVar45 & 1);
  auVar77._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar5._0_4_;
  bVar48 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar5._4_4_;
  bVar48 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar5._8_4_;
  bVar48 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar5._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar45 >> 7) * 0x219392ef;
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar50 = vfnmadd213ps_fma(auVar79,auVar81,auVar100);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar76);
  auVar54 = vfnmadd213ps_fma(auVar76,auVar81,auVar100);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar81,auVar81);
  auVar82 = vrcp14ps_avx512vl(auVar77);
  auVar5 = vfnmadd213ps_fma(auVar77,auVar82,auVar100);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar40 * 7 + 6));
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar82,auVar82);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar82 = vsubps_avx512vl(auVar81,auVar80);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar40 * 9 + 6));
  auVar88._4_4_ = auVar50._4_4_ * auVar82._4_4_;
  auVar88._0_4_ = auVar50._0_4_ * auVar82._0_4_;
  auVar88._8_4_ = auVar50._8_4_ * auVar82._8_4_;
  auVar88._12_4_ = auVar50._12_4_ * auVar82._12_4_;
  auVar88._16_4_ = auVar82._16_4_ * 0.0;
  auVar88._20_4_ = auVar82._20_4_ * 0.0;
  auVar88._24_4_ = auVar82._24_4_ * 0.0;
  auVar88._28_4_ = auVar82._28_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vsubps_avx512vl(auVar81,auVar80);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar40 * 0xe + 6));
  auVar98._0_4_ = auVar50._0_4_ * auVar80._0_4_;
  auVar98._4_4_ = auVar50._4_4_ * auVar80._4_4_;
  auVar98._8_4_ = auVar50._8_4_ * auVar80._8_4_;
  auVar98._12_4_ = auVar50._12_4_ * auVar80._12_4_;
  auVar98._16_4_ = auVar80._16_4_ * 0.0;
  auVar98._20_4_ = auVar80._20_4_ * 0.0;
  auVar98._24_4_ = auVar80._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar59));
  auVar89._4_4_ = auVar54._4_4_ * auVar81._4_4_;
  auVar89._0_4_ = auVar54._0_4_ * auVar81._0_4_;
  auVar89._8_4_ = auVar54._8_4_ * auVar81._8_4_;
  auVar89._12_4_ = auVar54._12_4_ * auVar81._12_4_;
  auVar89._16_4_ = auVar81._16_4_ * 0.0;
  auVar89._20_4_ = auVar81._20_4_ * 0.0;
  auVar89._24_4_ = auVar81._24_4_ * 0.0;
  auVar89._28_4_ = auVar81._28_4_;
  auVar83 = vpbroadcastd_avx512vl();
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar59));
  auVar94._0_4_ = auVar54._0_4_ * auVar81._0_4_;
  auVar94._4_4_ = auVar54._4_4_ * auVar81._4_4_;
  auVar94._8_4_ = auVar54._8_4_ * auVar81._8_4_;
  auVar94._12_4_ = auVar54._12_4_ * auVar81._12_4_;
  auVar94._16_4_ = auVar81._16_4_ * 0.0;
  auVar94._20_4_ = auVar81._20_4_ * 0.0;
  auVar94._24_4_ = auVar81._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar40 * 0x15 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar60));
  auVar90._4_4_ = auVar81._4_4_ * auVar5._4_4_;
  auVar90._0_4_ = auVar81._0_4_ * auVar5._0_4_;
  auVar90._8_4_ = auVar81._8_4_ * auVar5._8_4_;
  auVar90._12_4_ = auVar81._12_4_ * auVar5._12_4_;
  auVar90._16_4_ = auVar81._16_4_ * 0.0;
  auVar90._20_4_ = auVar81._20_4_ * 0.0;
  auVar90._24_4_ = auVar81._24_4_ * 0.0;
  auVar90._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar40 * 0x17 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar60));
  auVar93._0_4_ = auVar5._0_4_ * auVar81._0_4_;
  auVar93._4_4_ = auVar5._4_4_ * auVar81._4_4_;
  auVar93._8_4_ = auVar5._8_4_ * auVar81._8_4_;
  auVar93._12_4_ = auVar5._12_4_ * auVar81._12_4_;
  auVar93._16_4_ = auVar81._16_4_ * 0.0;
  auVar93._20_4_ = auVar81._20_4_ * 0.0;
  auVar93._24_4_ = auVar81._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar81 = vpminsd_avx2(auVar88,auVar98);
  auVar80 = vpminsd_avx2(auVar89,auVar94);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80 = vpminsd_avx2(auVar90,auVar93);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar82._4_4_ = uVar129;
  auVar82._0_4_ = uVar129;
  auVar82._8_4_ = uVar129;
  auVar82._12_4_ = uVar129;
  auVar82._16_4_ = uVar129;
  auVar82._20_4_ = uVar129;
  auVar82._24_4_ = uVar129;
  auVar82._28_4_ = uVar129;
  auVar80 = vmaxps_avx512vl(auVar80,auVar82);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar81,auVar80);
  auVar81 = vpmaxsd_avx2(auVar88,auVar98);
  auVar80 = vpmaxsd_avx2(auVar89,auVar94);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar80 = vpmaxsd_avx2(auVar90,auVar93);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar96._4_4_ = uVar129;
  auVar96._0_4_ = uVar129;
  auVar96._8_4_ = uVar129;
  auVar96._12_4_ = uVar129;
  auVar96._16_4_ = uVar129;
  auVar96._20_4_ = uVar129;
  auVar96._24_4_ = uVar129;
  auVar96._28_4_ = uVar129;
  auVar80 = vminps_avx512vl(auVar80,auVar96);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar97._8_4_ = 0x3f800003;
  auVar97._0_8_ = 0x3f8000033f800003;
  auVar97._12_4_ = 0x3f800003;
  auVar97._16_4_ = 0x3f800003;
  auVar97._20_4_ = 0x3f800003;
  auVar97._24_4_ = 0x3f800003;
  auVar97._28_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar97);
  uVar15 = vcmpps_avx512vl(local_1c0,auVar81,2);
  uVar16 = vpcmpgtd_avx512vl(auVar83,_DAT_01fb4ba0);
  uVar45 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar16));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar253 = ZEXT1664(auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar255 = ZEXT1664(auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar256 = ZEXT1664(auVar50);
  auVar262 = ZEXT464(0x3f800000);
  auVar81._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar261 = ZEXT1664(auVar81._0_16_);
LAB_01a2fa30:
  if (uVar45 == 0) {
    return;
  }
  lVar42 = 0;
  for (uVar40 = uVar45; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
    lVar42 = lVar42 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar42 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar40 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar50 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar40);
  lVar42 = uVar40 + 1;
  auVar54 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * lVar42);
  _Var10 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * uVar40);
  auVar59 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * lVar42);
  auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar60 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  auVar245._8_4_ = 0x3eaaaaab;
  auVar245._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar245._12_4_ = 0x3eaaaaab;
  auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar8[2].intersectionFilterN +
                             (long)pGVar8[2].pointQueryFunc * uVar40),auVar50,auVar245);
  auVar55 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar8[2].intersectionFilterN +
                              (long)pGVar8[2].pointQueryFunc * lVar42),auVar54,auVar245);
  auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar8[3].userPtr +
                             uVar40 * *(long *)&pGVar8[3].fnumTimeSegments),auVar5,auVar245);
  auVar58 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar8[3].userPtr +
                              *(long *)&pGVar8[3].fnumTimeSegments * lVar42),auVar59,auVar245);
  auVar85._16_16_ = auVar81._16_16_;
  auVar85._0_16_ = vxorps_avx512vl(auVar252._0_16_,auVar252._0_16_);
  auVar51 = vmulps_avx512vl(auVar54,auVar85._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar51,auVar55,auVar85._0_16_);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar56,auVar52);
  auVar136._0_4_ = auVar50._0_4_ + auVar51._0_4_;
  auVar136._4_4_ = auVar50._4_4_ + auVar51._4_4_;
  auVar136._8_4_ = auVar50._8_4_ + auVar51._8_4_;
  auVar136._12_4_ = auVar50._12_4_ + auVar51._12_4_;
  auVar130 = auVar253._0_16_;
  auVar51 = vfmadd231ps_avx512vl(auVar52,auVar56,auVar130);
  auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar50,auVar130);
  auVar51 = vmulps_avx512vl(auVar59,auVar85._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar51,auVar58,auVar85._0_16_);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar57,auVar53);
  auVar233._0_4_ = auVar5._0_4_ + auVar51._0_4_;
  auVar233._4_4_ = auVar5._4_4_ + auVar51._4_4_;
  auVar233._8_4_ = auVar5._8_4_ + auVar51._8_4_;
  auVar233._12_4_ = auVar5._12_4_ + auVar51._12_4_;
  auVar51 = vfmadd231ps_avx512vl(auVar53,auVar57,auVar130);
  auVar53 = vfnmadd231ps_avx512vl(auVar51,auVar5,auVar130);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar55,auVar54);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar56,auVar85._0_16_);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar50,auVar85._0_16_);
  auVar54 = vmulps_avx512vl(auVar54,auVar130);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar130,auVar55);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar85._0_16_,auVar56);
  auVar55 = vfnmadd231ps_avx512vl(auVar54,auVar85._0_16_,auVar50);
  auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar58,auVar59);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar57,auVar85._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar50,auVar5,auVar85._0_16_);
  auVar50 = vmulps_avx512vl(auVar59,auVar130);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar130,auVar58);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar85._0_16_,auVar57);
  auVar57 = vfnmadd231ps_avx512vl(auVar50,auVar85._0_16_,auVar5);
  auVar50 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar54 = vshufps_avx(auVar233,auVar233,0xc9);
  fVar128 = auVar52._0_4_;
  auVar71._0_4_ = fVar128 * auVar54._0_4_;
  fVar133 = auVar52._4_4_;
  auVar71._4_4_ = fVar133 * auVar54._4_4_;
  fVar134 = auVar52._8_4_;
  auVar71._8_4_ = fVar134 * auVar54._8_4_;
  fVar135 = auVar52._12_4_;
  auVar71._12_4_ = fVar135 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar71,auVar50,auVar233);
  auVar5 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar190._0_4_ = auVar54._0_4_ * fVar128;
  auVar190._4_4_ = auVar54._4_4_ * fVar133;
  auVar190._8_4_ = auVar54._8_4_ * fVar134;
  auVar190._12_4_ = auVar54._12_4_ * fVar135;
  auVar50 = vfmsub231ps_fma(auVar190,auVar50,auVar53);
  auVar59 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar54 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar119 = auVar55._0_4_;
  auVar200._0_4_ = auVar54._0_4_ * fVar119;
  fVar208 = auVar55._4_4_;
  auVar200._4_4_ = auVar54._4_4_ * fVar208;
  fVar217 = auVar55._8_4_;
  auVar200._8_4_ = auVar54._8_4_ * fVar217;
  fVar218 = auVar55._12_4_;
  auVar200._12_4_ = auVar54._12_4_ * fVar218;
  auVar54 = vfmsub231ps_fma(auVar200,auVar50,auVar56);
  auVar56 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar201._0_4_ = auVar54._0_4_ * fVar119;
  auVar201._4_4_ = auVar54._4_4_ * fVar208;
  auVar201._8_4_ = auVar54._8_4_ * fVar217;
  auVar201._12_4_ = auVar54._12_4_ * fVar218;
  auVar50 = vfmsub231ps_fma(auVar201,auVar50,auVar57);
  auVar57 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar125 = auVar50._0_4_;
  auVar84._4_28_ = auVar85._4_28_;
  auVar84._0_4_ = fVar125;
  auVar54 = vrsqrt14ss_avx512f(auVar85._0_16_,auVar84._0_16_);
  auVar58 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
  fVar126 = auVar54._0_4_;
  fVar127 = auVar58._0_4_ - auVar53._0_4_ * fVar126 * fVar126 * fVar126;
  auVar54 = vdpps_avx(auVar5,auVar59,0x7f);
  fVar232 = fVar127 * auVar5._0_4_;
  fVar238 = fVar127 * auVar5._4_4_;
  fVar239 = fVar127 * auVar5._8_4_;
  fVar240 = fVar127 * auVar5._12_4_;
  auVar191._0_4_ = fVar125 * auVar59._0_4_;
  auVar191._4_4_ = fVar125 * auVar59._4_4_;
  auVar191._8_4_ = fVar125 * auVar59._8_4_;
  auVar191._12_4_ = fVar125 * auVar59._12_4_;
  fVar125 = auVar54._0_4_;
  auVar73._0_4_ = fVar125 * auVar5._0_4_;
  auVar73._4_4_ = fVar125 * auVar5._4_4_;
  auVar73._8_4_ = fVar125 * auVar5._8_4_;
  auVar73._12_4_ = fVar125 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar191,auVar73);
  auVar54 = vrcp14ss_avx512f(auVar85._0_16_,auVar84._0_16_);
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar54,ZEXT416(0x40000000));
  fVar125 = auVar54._0_4_ * auVar50._0_4_;
  auVar50 = vdpps_avx(auVar56,auVar56,0x7f);
  fVar126 = auVar50._0_4_;
  auVar87._16_16_ = auVar85._16_16_;
  auVar87._0_16_ = auVar85._0_16_;
  auVar86._4_28_ = auVar87._4_28_;
  auVar86._0_4_ = fVar126;
  auVar54 = vrsqrt14ss_avx512f(auVar85._0_16_,auVar86._0_16_);
  auVar59 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar58 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
  fVar142 = auVar54._0_4_;
  fVar142 = auVar59._0_4_ - auVar58._0_4_ * fVar142 * fVar142 * fVar142;
  auVar54 = vdpps_avx(auVar56,auVar57,0x7f);
  fVar219 = fVar142 * auVar56._0_4_;
  fVar229 = fVar142 * auVar56._4_4_;
  fVar230 = fVar142 * auVar56._8_4_;
  fVar231 = fVar142 * auVar56._12_4_;
  auVar68._0_4_ = fVar126 * auVar57._0_4_;
  auVar68._4_4_ = fVar126 * auVar57._4_4_;
  auVar68._8_4_ = fVar126 * auVar57._8_4_;
  auVar68._12_4_ = fVar126 * auVar57._12_4_;
  fVar126 = auVar54._0_4_;
  auVar70._0_4_ = fVar126 * auVar56._0_4_;
  auVar70._4_4_ = fVar126 * auVar56._4_4_;
  auVar70._8_4_ = fVar126 * auVar56._8_4_;
  auVar70._12_4_ = fVar126 * auVar56._12_4_;
  auVar59 = vsubps_avx(auVar68,auVar70);
  auVar54 = vrcp14ss_avx512f(auVar85._0_16_,auVar86._0_16_);
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar54,ZEXT416(0x40000000));
  fVar126 = auVar50._0_4_ * auVar54._0_4_;
  auVar50 = vshufps_avx(auVar136,auVar136,0xff);
  auVar177._0_4_ = fVar232 * auVar50._0_4_;
  auVar177._4_4_ = fVar238 * auVar50._4_4_;
  auVar177._8_4_ = fVar239 * auVar50._8_4_;
  auVar177._12_4_ = fVar240 * auVar50._12_4_;
  local_340 = vsubps_avx(auVar136,auVar177);
  auVar54 = vshufps_avx(auVar52,auVar52,0xff);
  auVar69._0_4_ = auVar54._0_4_ * fVar232 + auVar50._0_4_ * fVar127 * fVar125 * auVar5._0_4_;
  auVar69._4_4_ = auVar54._4_4_ * fVar238 + auVar50._4_4_ * fVar127 * fVar125 * auVar5._4_4_;
  auVar69._8_4_ = auVar54._8_4_ * fVar239 + auVar50._8_4_ * fVar127 * fVar125 * auVar5._8_4_;
  auVar69._12_4_ = auVar54._12_4_ * fVar240 + auVar50._12_4_ * fVar127 * fVar125 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar52,auVar69);
  local_350._0_4_ = auVar177._0_4_ + auVar136._0_4_;
  local_350._4_4_ = auVar177._4_4_ + auVar136._4_4_;
  fStack_348 = auVar177._8_4_ + auVar136._8_4_;
  fStack_344 = auVar177._12_4_ + auVar136._12_4_;
  auVar50 = vshufps_avx(auVar51,auVar51,0xff);
  auVar165._0_4_ = fVar219 * auVar50._0_4_;
  auVar165._4_4_ = fVar229 * auVar50._4_4_;
  auVar165._8_4_ = fVar230 * auVar50._8_4_;
  auVar165._12_4_ = fVar231 * auVar50._12_4_;
  local_360 = vsubps_avx512vl(auVar51,auVar165);
  auVar54 = vshufps_avx(auVar55,auVar55,0xff);
  auVar61._0_4_ = auVar54._0_4_ * fVar219 + auVar50._0_4_ * fVar142 * auVar59._0_4_ * fVar126;
  auVar61._4_4_ = auVar54._4_4_ * fVar229 + auVar50._4_4_ * fVar142 * auVar59._4_4_ * fVar126;
  auVar61._8_4_ = auVar54._8_4_ * fVar230 + auVar50._8_4_ * fVar142 * auVar59._8_4_ * fVar126;
  auVar61._12_4_ = auVar54._12_4_ * fVar231 + auVar50._12_4_ * fVar142 * auVar59._12_4_ * fVar126;
  auVar50 = vsubps_avx(auVar55,auVar61);
  _local_370 = vaddps_avx512vl(auVar51,auVar165);
  auVar72._0_4_ = auVar5._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar5._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar5._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar5._12_4_ * 0.33333334;
  local_380 = vaddps_avx512vl(local_340,auVar72);
  auVar75._0_4_ = auVar50._0_4_ * 0.33333334;
  auVar75._4_4_ = auVar50._4_4_ * 0.33333334;
  auVar75._8_4_ = auVar50._8_4_ * 0.33333334;
  auVar75._12_4_ = auVar50._12_4_ * 0.33333334;
  local_390 = vsubps_avx512vl(local_360,auVar75);
  auVar52._0_4_ = (fVar128 + auVar69._0_4_) * 0.33333334;
  auVar52._4_4_ = (fVar133 + auVar69._4_4_) * 0.33333334;
  auVar52._8_4_ = (fVar134 + auVar69._8_4_) * 0.33333334;
  auVar52._12_4_ = (fVar135 + auVar69._12_4_) * 0.33333334;
  _local_3a0 = vaddps_avx512vl(_local_350,auVar52);
  auVar53._0_4_ = (fVar119 + auVar61._0_4_) * 0.33333334;
  auVar53._4_4_ = (fVar208 + auVar61._4_4_) * 0.33333334;
  auVar53._8_4_ = (fVar217 + auVar61._8_4_) * 0.33333334;
  auVar53._12_4_ = (fVar218 + auVar61._12_4_) * 0.33333334;
  _local_3b0 = vsubps_avx512vl(_local_370,auVar53);
  local_2c0 = vsubps_avx(local_340,auVar60);
  uVar129 = local_2c0._0_4_;
  auVar62._4_4_ = uVar129;
  auVar62._0_4_ = uVar129;
  auVar62._8_4_ = uVar129;
  auVar62._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar54 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar119 = pre->ray_space[k].vz.field_0.m128[0];
  fVar208 = pre->ray_space[k].vz.field_0.m128[1];
  fVar217 = pre->ray_space[k].vz.field_0.m128[2];
  fVar218 = pre->ray_space[k].vz.field_0.m128[3];
  auVar130._0_4_ = fVar119 * auVar54._0_4_;
  auVar130._4_4_ = fVar208 * auVar54._4_4_;
  auVar130._8_4_ = fVar217 * auVar54._8_4_;
  auVar130._12_4_ = fVar218 * auVar54._12_4_;
  auVar50 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar4,auVar50);
  auVar57 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar62);
  local_2d0 = vsubps_avx512vl(local_380,auVar60);
  uVar129 = local_2d0._0_4_;
  auVar66._4_4_ = uVar129;
  auVar66._0_4_ = uVar129;
  auVar66._8_4_ = uVar129;
  auVar66._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar54 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar63._0_4_ = fVar119 * auVar54._0_4_;
  auVar63._4_4_ = fVar208 * auVar54._4_4_;
  auVar63._8_4_ = fVar217 * auVar54._8_4_;
  auVar63._12_4_ = fVar218 * auVar54._12_4_;
  auVar50 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar50);
  auVar51 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar66);
  local_2e0 = vsubps_avx512vl(local_390,auVar60);
  uVar129 = local_2e0._0_4_;
  auVar64._4_4_ = uVar129;
  auVar64._0_4_ = uVar129;
  auVar64._8_4_ = uVar129;
  auVar64._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar54 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar67._0_4_ = fVar119 * auVar54._0_4_;
  auVar67._4_4_ = fVar208 * auVar54._4_4_;
  auVar67._8_4_ = fVar217 * auVar54._8_4_;
  auVar67._12_4_ = fVar218 * auVar54._12_4_;
  auVar50 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar4,auVar50);
  auVar55 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar64);
  local_2f0 = vsubps_avx512vl(local_360,auVar60);
  uVar129 = local_2f0._0_4_;
  auVar178._4_4_ = uVar129;
  auVar178._0_4_ = uVar129;
  auVar178._8_4_ = uVar129;
  auVar178._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar54 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar65._0_4_ = fVar119 * auVar54._0_4_;
  auVar65._4_4_ = fVar208 * auVar54._4_4_;
  auVar65._8_4_ = fVar217 * auVar54._8_4_;
  auVar65._12_4_ = fVar218 * auVar54._12_4_;
  auVar50 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar4,auVar50);
  auVar58 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar178);
  local_300 = vsubps_avx(_local_350,auVar60);
  uVar129 = local_300._0_4_;
  auVar179._4_4_ = uVar129;
  auVar179._0_4_ = uVar129;
  auVar179._8_4_ = uVar129;
  auVar179._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_300,local_300,0x55);
  auVar54 = vshufps_avx(local_300,local_300,0xaa);
  auVar202._0_4_ = auVar54._0_4_ * fVar119;
  auVar202._4_4_ = auVar54._4_4_ * fVar208;
  auVar202._8_4_ = auVar54._8_4_ * fVar217;
  auVar202._12_4_ = auVar54._12_4_ * fVar218;
  auVar50 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar4,auVar50);
  auVar52 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar179);
  local_310 = vsubps_avx512vl(_local_3a0,auVar60);
  uVar129 = local_310._0_4_;
  auVar180._4_4_ = uVar129;
  auVar180._0_4_ = uVar129;
  auVar180._8_4_ = uVar129;
  auVar180._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_310,local_310,0x55);
  auVar54 = vshufps_avx(local_310,local_310,0xaa);
  auVar209._0_4_ = auVar54._0_4_ * fVar119;
  auVar209._4_4_ = auVar54._4_4_ * fVar208;
  auVar209._8_4_ = auVar54._8_4_ * fVar217;
  auVar209._12_4_ = auVar54._12_4_ * fVar218;
  auVar50 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar4,auVar50);
  auVar53 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar180);
  local_320 = vsubps_avx(_local_3b0,auVar60);
  uVar129 = local_320._0_4_;
  auVar181._4_4_ = uVar129;
  auVar181._0_4_ = uVar129;
  auVar181._8_4_ = uVar129;
  auVar181._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_320,local_320,0x55);
  auVar54 = vshufps_avx(local_320,local_320,0xaa);
  auVar220._0_4_ = auVar54._0_4_ * fVar119;
  auVar220._4_4_ = auVar54._4_4_ * fVar208;
  auVar220._8_4_ = auVar54._8_4_ * fVar217;
  auVar220._12_4_ = auVar54._12_4_ * fVar218;
  auVar50 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar4,auVar50);
  auVar130 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar181);
  local_330 = vsubps_avx512vl(_local_370,auVar60);
  uVar129 = local_330._0_4_;
  auVar120._4_4_ = uVar129;
  auVar120._0_4_ = uVar129;
  auVar120._8_4_ = uVar129;
  auVar120._12_4_ = uVar129;
  auVar50 = vshufps_avx(local_330,local_330,0x55);
  auVar54 = vshufps_avx(local_330,local_330,0xaa);
  auVar74._0_4_ = auVar54._0_4_ * fVar119;
  auVar74._4_4_ = auVar54._4_4_ * fVar208;
  auVar74._8_4_ = auVar54._8_4_ * fVar217;
  auVar74._12_4_ = auVar54._12_4_ * fVar218;
  auVar50 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar4,auVar50);
  auVar120 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar120);
  auVar5 = vmovlhps_avx(auVar57,auVar52);
  auVar59 = vmovlhps_avx(auVar51,auVar53);
  auVar56 = vmovlhps_avx512f(auVar55,auVar130);
  _local_2a0 = vmovlhps_avx512f(auVar58,auVar120);
  auVar54 = vminps_avx(auVar5,auVar59);
  auVar50 = vmaxps_avx(auVar5,auVar59);
  auVar60 = vminps_avx512vl(auVar56,_local_2a0);
  auVar54 = vminps_avx(auVar54,auVar60);
  auVar60 = vmaxps_avx512vl(auVar56,_local_2a0);
  auVar50 = vmaxps_avx(auVar50,auVar60);
  auVar60 = vshufpd_avx(auVar54,auVar54,3);
  auVar54 = vminps_avx(auVar54,auVar60);
  auVar60 = vshufpd_avx(auVar50,auVar50,3);
  auVar50 = vmaxps_avx(auVar50,auVar60);
  auVar54 = vandps_avx512vl(auVar54,auVar255._0_16_);
  auVar50 = vandps_avx512vl(auVar50,auVar255._0_16_);
  auVar50 = vmaxps_avx(auVar54,auVar50);
  auVar54 = vmovshdup_avx(auVar50);
  auVar50 = vmaxss_avx(auVar54,auVar50);
  local_468 = (uint)uVar45 + 0xff;
  auVar60 = vmovddup_avx512vl(auVar57);
  auVar57 = vmovddup_avx512vl(auVar51);
  auVar51 = vmovddup_avx512vl(auVar55);
  auVar131._8_8_ = auVar58._0_8_;
  auVar131._0_8_ = auVar58._0_8_;
  local_2b0 = ZEXT416((uint)(auVar50._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2b0);
  auVar50 = vxorps_avx512vl(local_260._0_16_,auVar256._0_16_);
  local_280 = vbroadcastss_avx512vl(auVar50);
  uVar40 = 0;
  auVar50 = vsubps_avx(auVar59,auVar5);
  auVar101._0_16_ = vsubps_avx512vl(auVar56,auVar59);
  local_290 = vsubps_avx512vl(_local_2a0,auVar56);
  local_3c0 = vsubps_avx(_local_350,local_340);
  local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  _local_3f0 = vsubps_avx512vl(_local_370,local_360);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar54 = ZEXT816(0x3f80000000000000);
  auVar58 = auVar54;
LAB_01a3013c:
  do {
    auVar55 = vshufps_avx(auVar58,auVar58,0x50);
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = 0x3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar244._16_4_ = 0x3f800000;
    auVar244._0_16_ = auVar241;
    auVar244._20_4_ = 0x3f800000;
    auVar244._24_4_ = 0x3f800000;
    auVar244._28_4_ = 0x3f800000;
    auVar136 = vsubps_avx(auVar241,auVar55);
    fVar119 = auVar55._0_4_;
    fVar125 = auVar52._0_4_;
    auVar150._0_4_ = fVar125 * fVar119;
    fVar208 = auVar55._4_4_;
    fVar126 = auVar52._4_4_;
    auVar150._4_4_ = fVar126 * fVar208;
    fVar217 = auVar55._8_4_;
    auVar150._8_4_ = fVar125 * fVar217;
    fVar218 = auVar55._12_4_;
    auVar150._12_4_ = fVar126 * fVar218;
    fVar127 = auVar53._0_4_;
    auVar156._0_4_ = fVar127 * fVar119;
    fVar142 = auVar53._4_4_;
    auVar156._4_4_ = fVar142 * fVar208;
    auVar156._8_4_ = fVar127 * fVar217;
    auVar156._12_4_ = fVar142 * fVar218;
    fVar128 = auVar130._0_4_;
    auVar166._0_4_ = fVar128 * fVar119;
    fVar133 = auVar130._4_4_;
    auVar166._4_4_ = fVar133 * fVar208;
    auVar166._8_4_ = fVar128 * fVar217;
    auVar166._12_4_ = fVar133 * fVar218;
    fVar134 = auVar120._0_4_;
    auVar137._0_4_ = fVar134 * fVar119;
    fVar135 = auVar120._4_4_;
    auVar137._4_4_ = fVar135 * fVar208;
    auVar137._8_4_ = fVar134 * fVar217;
    auVar137._12_4_ = fVar135 * fVar218;
    auVar61 = vfmadd231ps_avx512vl(auVar150,auVar136,auVar60);
    auVar62 = vfmadd231ps_avx512vl(auVar156,auVar136,auVar57);
    auVar63 = vfmadd231ps_avx512vl(auVar166,auVar136,auVar51);
    auVar136 = vfmadd231ps_fma(auVar137,auVar131,auVar136);
    auVar55 = vmovshdup_avx(auVar54);
    fVar208 = auVar54._0_4_;
    fVar119 = (auVar55._0_4_ - fVar208) * 0.04761905;
    auVar189._4_4_ = fVar208;
    auVar189._0_4_ = fVar208;
    auVar189._8_4_ = fVar208;
    auVar189._12_4_ = fVar208;
    auVar189._16_4_ = fVar208;
    auVar189._20_4_ = fVar208;
    auVar189._24_4_ = fVar208;
    auVar189._28_4_ = fVar208;
    auVar148._0_8_ = auVar55._0_8_;
    auVar148._8_8_ = auVar148._0_8_;
    auVar148._16_8_ = auVar148._0_8_;
    auVar148._24_8_ = auVar148._0_8_;
    auVar81 = vsubps_avx(auVar148,auVar189);
    uVar129 = auVar61._0_4_;
    auVar149._4_4_ = uVar129;
    auVar149._0_4_ = uVar129;
    auVar149._8_4_ = uVar129;
    auVar149._12_4_ = uVar129;
    auVar149._16_4_ = uVar129;
    auVar149._20_4_ = uVar129;
    auVar149._24_4_ = uVar129;
    auVar149._28_4_ = uVar129;
    auVar205._8_4_ = 1;
    auVar205._0_8_ = 0x100000001;
    auVar205._12_4_ = 1;
    auVar205._16_4_ = 1;
    auVar205._20_4_ = 1;
    auVar205._24_4_ = 1;
    auVar205._28_4_ = 1;
    auVar96 = ZEXT1632(auVar61);
    auVar80 = vpermps_avx2(auVar205,auVar96);
    auVar82 = vbroadcastss_avx512vl(auVar62);
    auVar97 = ZEXT1632(auVar62);
    auVar83 = vpermps_avx512vl(auVar205,auVar97);
    auVar88 = vbroadcastss_avx512vl(auVar63);
    auVar77 = ZEXT1632(auVar63);
    auVar89 = vpermps_avx512vl(auVar205,auVar77);
    auVar90 = vbroadcastss_avx512vl(auVar136);
    auVar93 = ZEXT1632(auVar136);
    auVar91 = vpermps_avx512vl(auVar205,auVar93);
    auVar206._4_4_ = fVar119;
    auVar206._0_4_ = fVar119;
    auVar206._8_4_ = fVar119;
    auVar206._12_4_ = fVar119;
    auVar206._16_4_ = fVar119;
    auVar206._20_4_ = fVar119;
    auVar206._24_4_ = fVar119;
    auVar206._28_4_ = fVar119;
    auVar94 = auVar260._0_32_;
    auVar78 = vpermps_avx512vl(auVar94,auVar96);
    auVar176._8_4_ = 3;
    auVar176._0_8_ = 0x300000003;
    auVar176._12_4_ = 3;
    auVar176._16_4_ = 3;
    auVar176._20_4_ = 3;
    auVar176._24_4_ = 3;
    auVar176._28_4_ = 3;
    auVar79 = vpermps_avx512vl(auVar176,auVar96);
    auVar92 = vpermps_avx512vl(auVar94,auVar97);
    auVar96 = vpermps_avx2(auVar176,auVar97);
    auVar76 = vpermps_avx512vl(auVar94,auVar77);
    auVar97 = vpermps_avx2(auVar176,auVar77);
    auVar77 = vpermps_avx512vl(auVar94,auVar93);
    auVar93 = vpermps_avx512vl(auVar176,auVar93);
    auVar55 = vfmadd132ps_fma(auVar81,auVar189,_DAT_01f7b040);
    auVar81 = vsubps_avx(auVar244,ZEXT1632(auVar55));
    auVar94 = vmulps_avx512vl(auVar82,ZEXT1632(auVar55));
    auVar98 = ZEXT1632(auVar55);
    auVar95 = vmulps_avx512vl(auVar83,auVar98);
    auVar136 = vfmadd231ps_fma(auVar94,auVar81,auVar149);
    auVar61 = vfmadd231ps_fma(auVar95,auVar81,auVar80);
    auVar94 = vmulps_avx512vl(auVar88,auVar98);
    auVar95 = vmulps_avx512vl(auVar89,auVar98);
    auVar82 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar95,auVar81,auVar83);
    auVar94 = vmulps_avx512vl(auVar90,auVar98);
    auVar95 = ZEXT1632(auVar55);
    auVar91 = vmulps_avx512vl(auVar91,auVar95);
    auVar88 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar88);
    auVar89 = vfmadd231ps_avx512vl(auVar91,auVar81,auVar89);
    fVar217 = auVar55._0_4_;
    fVar218 = auVar55._4_4_;
    auVar21._4_4_ = fVar218 * auVar82._4_4_;
    auVar21._0_4_ = fVar217 * auVar82._0_4_;
    fVar219 = auVar55._8_4_;
    auVar21._8_4_ = fVar219 * auVar82._8_4_;
    fVar229 = auVar55._12_4_;
    auVar21._12_4_ = fVar229 * auVar82._12_4_;
    auVar21._16_4_ = auVar82._16_4_ * 0.0;
    auVar21._20_4_ = auVar82._20_4_ * 0.0;
    auVar21._24_4_ = auVar82._24_4_ * 0.0;
    auVar21._28_4_ = fVar208;
    auVar22._4_4_ = fVar218 * auVar83._4_4_;
    auVar22._0_4_ = fVar217 * auVar83._0_4_;
    auVar22._8_4_ = fVar219 * auVar83._8_4_;
    auVar22._12_4_ = fVar229 * auVar83._12_4_;
    auVar22._16_4_ = auVar83._16_4_ * 0.0;
    auVar22._20_4_ = auVar83._20_4_ * 0.0;
    auVar22._24_4_ = auVar83._24_4_ * 0.0;
    auVar22._28_4_ = auVar80._28_4_;
    auVar136 = vfmadd231ps_fma(auVar21,auVar81,ZEXT1632(auVar136));
    auVar61 = vfmadd231ps_fma(auVar22,auVar81,ZEXT1632(auVar61));
    auVar140._0_4_ = fVar217 * auVar88._0_4_;
    auVar140._4_4_ = fVar218 * auVar88._4_4_;
    auVar140._8_4_ = fVar219 * auVar88._8_4_;
    auVar140._12_4_ = fVar229 * auVar88._12_4_;
    auVar140._16_4_ = auVar88._16_4_ * 0.0;
    auVar140._20_4_ = auVar88._20_4_ * 0.0;
    auVar140._24_4_ = auVar88._24_4_ * 0.0;
    auVar140._28_4_ = 0;
    auVar23._4_4_ = fVar218 * auVar89._4_4_;
    auVar23._0_4_ = fVar217 * auVar89._0_4_;
    auVar23._8_4_ = fVar219 * auVar89._8_4_;
    auVar23._12_4_ = fVar229 * auVar89._12_4_;
    auVar23._16_4_ = auVar89._16_4_ * 0.0;
    auVar23._20_4_ = auVar89._20_4_ * 0.0;
    auVar23._24_4_ = auVar89._24_4_ * 0.0;
    auVar23._28_4_ = auVar88._28_4_;
    auVar62 = vfmadd231ps_fma(auVar140,auVar81,auVar82);
    auVar63 = vfmadd231ps_fma(auVar23,auVar81,auVar83);
    auVar24._28_4_ = auVar83._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar229 * auVar63._12_4_,
                            CONCAT48(fVar219 * auVar63._8_4_,
                                     CONCAT44(fVar218 * auVar63._4_4_,fVar217 * auVar63._0_4_))));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar229 * auVar62._12_4_,
                                                 CONCAT48(fVar219 * auVar62._8_4_,
                                                          CONCAT44(fVar218 * auVar62._4_4_,
                                                                   fVar217 * auVar62._0_4_)))),
                              auVar81,ZEXT1632(auVar136));
    auVar75 = vfmadd231ps_fma(auVar24,auVar81,ZEXT1632(auVar61));
    auVar80 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar136));
    auVar82 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61));
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar80 = vmulps_avx512vl(auVar80,auVar83);
    auVar82 = vmulps_avx512vl(auVar82,auVar83);
    auVar199._0_4_ = fVar119 * auVar80._0_4_;
    auVar199._4_4_ = fVar119 * auVar80._4_4_;
    auVar199._8_4_ = fVar119 * auVar80._8_4_;
    auVar199._12_4_ = fVar119 * auVar80._12_4_;
    auVar199._16_4_ = fVar119 * auVar80._16_4_;
    auVar199._20_4_ = fVar119 * auVar80._20_4_;
    auVar199._24_4_ = fVar119 * auVar80._24_4_;
    auVar199._28_4_ = 0;
    auVar80 = vmulps_avx512vl(auVar206,auVar82);
    auVar61 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
    auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar88 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar141._0_4_ = auVar199._0_4_ + auVar72._0_4_;
    auVar141._4_4_ = auVar199._4_4_ + auVar72._4_4_;
    auVar141._8_4_ = auVar199._8_4_ + auVar72._8_4_;
    auVar141._12_4_ = auVar199._12_4_ + auVar72._12_4_;
    auVar141._16_4_ = auVar199._16_4_ + 0.0;
    auVar141._20_4_ = auVar199._20_4_ + 0.0;
    auVar141._24_4_ = auVar199._24_4_ + 0.0;
    auVar141._28_4_ = 0;
    auVar98 = ZEXT1632(auVar61);
    auVar89 = vpermt2ps_avx512vl(auVar199,_DAT_01fb9fc0,auVar98);
    auVar90 = vaddps_avx512vl(ZEXT1632(auVar75),auVar80);
    auVar91 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar98);
    auVar80 = vsubps_avx(auVar82,auVar89);
    auVar89 = vsubps_avx512vl(auVar88,auVar91);
    auVar91 = vmulps_avx512vl(auVar92,auVar95);
    auVar94 = vmulps_avx512vl(auVar96,auVar95);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar81,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar79);
    auVar79 = vmulps_avx512vl(auVar76,auVar95);
    auVar94 = vmulps_avx512vl(auVar97,auVar95);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar81,auVar92);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar96);
    auVar92 = vmulps_avx512vl(auVar77,auVar95);
    auVar77 = vmulps_avx512vl(auVar93,auVar95);
    auVar136 = vfmadd231ps_fma(auVar92,auVar81,auVar76);
    auVar92 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar97);
    auVar76 = vmulps_avx512vl(auVar95,auVar79);
    auVar93 = ZEXT1632(auVar55);
    auVar77 = vmulps_avx512vl(auVar93,auVar96);
    auVar91 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar91);
    auVar78 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar78);
    auVar92 = vmulps_avx512vl(auVar93,auVar92);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar229 * auVar136._12_4_,
                                            CONCAT48(fVar219 * auVar136._8_4_,
                                                     CONCAT44(fVar218 * auVar136._4_4_,
                                                              fVar217 * auVar136._0_4_)))),auVar81,
                         auVar79);
    auVar96 = vfmadd231ps_avx512vl(auVar92,auVar81,auVar96);
    auVar25._4_4_ = fVar218 * auVar79._4_4_;
    auVar25._0_4_ = fVar217 * auVar79._0_4_;
    auVar25._8_4_ = fVar219 * auVar79._8_4_;
    auVar25._12_4_ = fVar229 * auVar79._12_4_;
    auVar25._16_4_ = auVar79._16_4_ * 0.0;
    auVar25._20_4_ = auVar79._20_4_ * 0.0;
    auVar25._24_4_ = auVar79._24_4_ * 0.0;
    auVar25._28_4_ = auVar97._28_4_;
    auVar97 = vmulps_avx512vl(auVar93,auVar96);
    auVar92 = vfmadd231ps_avx512vl(auVar25,auVar81,auVar91);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar78,auVar81);
    auVar81 = vsubps_avx512vl(auVar79,auVar91);
    auVar96 = vsubps_avx512vl(auVar96,auVar78);
    auVar81 = vmulps_avx512vl(auVar81,auVar83);
    auVar96 = vmulps_avx512vl(auVar96,auVar83);
    fVar208 = fVar119 * auVar81._0_4_;
    fVar217 = fVar119 * auVar81._4_4_;
    auVar26._4_4_ = fVar217;
    auVar26._0_4_ = fVar208;
    fVar218 = fVar119 * auVar81._8_4_;
    auVar26._8_4_ = fVar218;
    fVar219 = fVar119 * auVar81._12_4_;
    auVar26._12_4_ = fVar219;
    fVar229 = fVar119 * auVar81._16_4_;
    auVar26._16_4_ = fVar229;
    fVar230 = fVar119 * auVar81._20_4_;
    auVar26._20_4_ = fVar230;
    fVar119 = fVar119 * auVar81._24_4_;
    auVar26._24_4_ = fVar119;
    auVar26._28_4_ = auVar81._28_4_;
    auVar96 = vmulps_avx512vl(auVar206,auVar96);
    auVar83 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,auVar98);
    auVar91 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar98);
    auVar207._0_4_ = auVar92._0_4_ + fVar208;
    auVar207._4_4_ = auVar92._4_4_ + fVar217;
    auVar207._8_4_ = auVar92._8_4_ + fVar218;
    auVar207._12_4_ = auVar92._12_4_ + fVar219;
    auVar207._16_4_ = auVar92._16_4_ + fVar229;
    auVar207._20_4_ = auVar92._20_4_ + fVar230;
    auVar207._24_4_ = auVar92._24_4_ + fVar119;
    auVar207._28_4_ = auVar92._28_4_ + auVar81._28_4_;
    auVar81 = vpermt2ps_avx512vl(auVar26,_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar78 = vaddps_avx512vl(auVar97,auVar96);
    auVar252 = ZEXT3264(auVar78);
    auVar96 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar81 = vsubps_avx(auVar83,auVar81);
    auVar96 = vsubps_avx512vl(auVar91,auVar96);
    auVar153 = ZEXT1632(auVar72);
    auVar79 = vsubps_avx512vl(auVar92,auVar153);
    auVar162 = ZEXT1632(auVar75);
    auVar76 = vsubps_avx512vl(auVar97,auVar162);
    auVar77 = vsubps_avx512vl(auVar83,auVar82);
    auVar79 = vaddps_avx512vl(auVar79,auVar77);
    auVar77 = vsubps_avx512vl(auVar91,auVar88);
    auVar76 = vaddps_avx512vl(auVar76,auVar77);
    auVar77 = vmulps_avx512vl(auVar162,auVar79);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar153,auVar76);
    auVar93 = vmulps_avx512vl(auVar90,auVar79);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar141,auVar76);
    auVar94 = vmulps_avx512vl(auVar89,auVar79);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar80,auVar76);
    auVar95 = vmulps_avx512vl(auVar88,auVar79);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar82,auVar76);
    auVar98 = vmulps_avx512vl(auVar97,auVar79);
    auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar92,auVar76);
    auVar99 = vmulps_avx512vl(auVar78,auVar79);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar207,auVar76);
    auVar100 = vmulps_avx512vl(auVar96,auVar79);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar81,auVar76);
    auVar79 = vmulps_avx512vl(auVar91,auVar79);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar83,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar93);
    auVar77 = vmaxps_avx512vl(auVar77,auVar93);
    auVar93 = vminps_avx512vl(auVar94,auVar95);
    auVar76 = vminps_avx512vl(auVar76,auVar93);
    auVar93 = vmaxps_avx512vl(auVar94,auVar95);
    auVar77 = vmaxps_avx512vl(auVar77,auVar93);
    auVar93 = vminps_avx512vl(auVar98,auVar99);
    auVar94 = vmaxps_avx512vl(auVar98,auVar99);
    auVar95 = vminps_avx512vl(auVar100,auVar79);
    auVar93 = vminps_avx512vl(auVar93,auVar95);
    auVar76 = vminps_avx512vl(auVar76,auVar93);
    auVar79 = vmaxps_avx512vl(auVar100,auVar79);
    auVar79 = vmaxps_avx512vl(auVar94,auVar79);
    auVar79 = vmaxps_avx512vl(auVar77,auVar79);
    uVar15 = vcmpps_avx512vl(auVar76,local_260,2);
    uVar16 = vcmpps_avx512vl(auVar79,local_280,5);
    bVar38 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar38 != 0) {
      auVar79 = vsubps_avx512vl(auVar82,auVar153);
      auVar76 = vsubps_avx512vl(auVar88,auVar162);
      auVar77 = vsubps_avx512vl(auVar83,auVar92);
      auVar79 = vaddps_avx512vl(auVar79,auVar77);
      auVar77 = vsubps_avx512vl(auVar91,auVar97);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar162,auVar79);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar153);
      auVar90 = vmulps_avx512vl(auVar90,auVar79);
      auVar90 = vfnmadd213ps_avx512vl(auVar141,auVar76,auVar90);
      auVar89 = vmulps_avx512vl(auVar89,auVar79);
      auVar89 = vfnmadd213ps_avx512vl(auVar80,auVar76,auVar89);
      auVar80 = vmulps_avx512vl(auVar88,auVar79);
      auVar88 = vfnmadd231ps_avx512vl(auVar80,auVar76,auVar82);
      auVar80 = vmulps_avx512vl(auVar97,auVar79);
      auVar97 = vfnmadd231ps_avx512vl(auVar80,auVar76,auVar92);
      auVar80 = vmulps_avx512vl(auVar78,auVar79);
      auVar78 = vfnmadd213ps_avx512vl(auVar207,auVar76,auVar80);
      auVar80 = vmulps_avx512vl(auVar96,auVar79);
      auVar92 = vfnmadd213ps_avx512vl(auVar81,auVar76,auVar80);
      auVar81 = vmulps_avx512vl(auVar91,auVar79);
      auVar83 = vfnmadd231ps_avx512vl(auVar81,auVar83,auVar76);
      auVar80 = vminps_avx(auVar77,auVar90);
      auVar81 = vmaxps_avx(auVar77,auVar90);
      auVar82 = vminps_avx(auVar89,auVar88);
      auVar82 = vminps_avx(auVar80,auVar82);
      auVar80 = vmaxps_avx(auVar89,auVar88);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      auVar96 = vminps_avx(auVar97,auVar78);
      auVar80 = vmaxps_avx(auVar97,auVar78);
      auVar97 = vminps_avx(auVar92,auVar83);
      auVar96 = vminps_avx(auVar96,auVar97);
      auVar96 = vminps_avx(auVar82,auVar96);
      auVar82 = vmaxps_avx(auVar92,auVar83);
      auVar80 = vmaxps_avx(auVar80,auVar82);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      uVar15 = vcmpps_avx512vl(auVar81,local_280,5);
      uVar16 = vcmpps_avx512vl(auVar96,local_260,2);
      bVar38 = bVar38 & (byte)uVar15 & (byte)uVar16;
      if (bVar38 != 0) {
        auStack_430[uVar40] = (uint)bVar38;
        uVar15 = vmovlps_avx(auVar54);
        (&uStack_240)[uVar40] = uVar15;
        uVar2 = vmovlps_avx(auVar58);
        auStack_1a0[uVar40] = uVar2;
        uVar40 = (ulong)((int)uVar40 + 1);
      }
    }
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar253 = ZEXT1664(auVar54);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar255 = ZEXT1664(auVar54);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar256 = ZEXT1664(auVar54);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar254 = ZEXT3264(auVar81);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar257 = ZEXT1664(auVar54);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar258 = ZEXT1664(auVar54);
    auVar259 = ZEXT3264(_DAT_01fb9fe0);
    auVar101._16_16_ = DAT_01fb9fe0._16_16_;
    auVar81 = auVar101;
LAB_01a3063a:
    do {
      do {
        do {
          if ((int)uVar40 == 0) {
            uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar20._4_4_ = uVar129;
            auVar20._0_4_ = uVar129;
            auVar20._8_4_ = uVar129;
            auVar20._12_4_ = uVar129;
            auVar20._16_4_ = uVar129;
            auVar20._20_4_ = uVar129;
            auVar20._24_4_ = uVar129;
            auVar20._28_4_ = uVar129;
            uVar15 = vcmpps_avx512vl(local_1c0,auVar20,2);
            uVar45 = (ulong)((uint)uVar45 & local_468 & (uint)uVar15);
            goto LAB_01a2fa30;
          }
          uVar39 = (int)uVar40 - 1;
          uVar41 = (ulong)uVar39;
          uVar118 = auStack_430[uVar41];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = auStack_1a0[uVar41];
          uVar2 = 0;
          for (uVar44 = (ulong)uVar118; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000
              ) {
            uVar2 = uVar2 + 1;
          }
          uVar43 = uVar118 - 1 & uVar118;
          bVar48 = uVar43 == 0;
          auStack_430[uVar41] = uVar43;
          if (bVar48) {
            uVar40 = (ulong)uVar39;
          }
          auVar121._8_8_ = 0;
          auVar121._0_8_ = uVar2;
          auVar54 = vpunpcklqdq_avx(auVar121,ZEXT416((int)uVar2 + 1));
          auVar54 = vcvtqq2ps_avx512vl(auVar54);
          auVar54 = vmulps_avx512vl(auVar54,auVar257._0_16_);
          uVar129 = *(undefined4 *)((long)&uStack_240 + uVar41 * 8 + 4);
          auVar17._4_4_ = uVar129;
          auVar17._0_4_ = uVar129;
          auVar17._8_4_ = uVar129;
          auVar17._12_4_ = uVar129;
          auVar55 = vmulps_avx512vl(auVar54,auVar17);
          auVar136 = auVar258._0_16_;
          auVar54 = vsubps_avx512vl(auVar136,auVar54);
          uVar129 = *(undefined4 *)(&uStack_240 + uVar41);
          auVar18._4_4_ = uVar129;
          auVar18._0_4_ = uVar129;
          auVar18._8_4_ = uVar129;
          auVar18._12_4_ = uVar129;
          auVar54 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar18);
          auVar55 = vmovshdup_avx(auVar54);
          fVar119 = auVar55._0_4_ - auVar54._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar119));
          if (uVar118 == 0 || bVar48) goto LAB_01a3013c;
          auVar55 = vshufps_avx(auVar58,auVar58,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar119));
          auVar63 = vsubps_avx512vl(auVar136,auVar55);
          fVar208 = auVar55._0_4_;
          auVar157._0_4_ = fVar208 * fVar125;
          fVar217 = auVar55._4_4_;
          auVar157._4_4_ = fVar217 * fVar126;
          fVar218 = auVar55._8_4_;
          auVar157._8_4_ = fVar218 * fVar125;
          fVar219 = auVar55._12_4_;
          auVar157._12_4_ = fVar219 * fVar126;
          auVar167._0_4_ = fVar208 * fVar127;
          auVar167._4_4_ = fVar217 * fVar142;
          auVar167._8_4_ = fVar218 * fVar127;
          auVar167._12_4_ = fVar219 * fVar142;
          auVar172._0_4_ = fVar208 * fVar128;
          auVar172._4_4_ = fVar217 * fVar133;
          auVar172._8_4_ = fVar218 * fVar128;
          auVar172._12_4_ = fVar219 * fVar133;
          auVar143._0_4_ = fVar208 * fVar134;
          auVar143._4_4_ = fVar217 * fVar135;
          auVar143._8_4_ = fVar218 * fVar134;
          auVar143._12_4_ = fVar219 * fVar135;
          auVar55 = vfmadd231ps_fma(auVar157,auVar63,auVar60);
          auVar61 = vfmadd231ps_fma(auVar167,auVar63,auVar57);
          auVar62 = vfmadd231ps_fma(auVar172,auVar63,auVar51);
          auVar63 = vfmadd231ps_fma(auVar143,auVar63,auVar131);
          auVar154._16_16_ = auVar55;
          auVar154._0_16_ = auVar55;
          auVar163._16_16_ = auVar61;
          auVar163._0_16_ = auVar61;
          auVar171._16_16_ = auVar62;
          auVar171._0_16_ = auVar62;
          auVar80 = vpermps_avx512vl(auVar259._0_32_,ZEXT1632(auVar54));
          auVar81 = vsubps_avx(auVar163,auVar154);
          auVar61 = vfmadd213ps_fma(auVar81,auVar80,auVar154);
          auVar81 = vsubps_avx(auVar171,auVar163);
          auVar72 = vfmadd213ps_fma(auVar81,auVar80,auVar163);
          auVar55 = vsubps_avx(auVar63,auVar62);
          auVar164._16_16_ = auVar55;
          auVar164._0_16_ = auVar55;
          auVar55 = vfmadd213ps_fma(auVar164,auVar80,auVar171);
          auVar81 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar61));
          auVar61 = vfmadd213ps_fma(auVar81,auVar80,ZEXT1632(auVar61));
          auVar81 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar72));
          auVar55 = vfmadd213ps_fma(auVar81,auVar80,ZEXT1632(auVar72));
          auVar81 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar61));
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar81,auVar80);
          auVar81 = vmulps_avx512vl(auVar81,auVar254._0_32_);
          fVar208 = fVar119 * 0.33333334;
          auVar173._0_8_ =
               CONCAT44(auVar165._4_4_ + fVar208 * auVar81._4_4_,
                        auVar165._0_4_ + fVar208 * auVar81._0_4_);
          auVar173._8_4_ = auVar165._8_4_ + fVar208 * auVar81._8_4_;
          auVar173._12_4_ = auVar165._12_4_ + fVar208 * auVar81._12_4_;
          auVar158._0_4_ = fVar208 * auVar81._16_4_;
          auVar158._4_4_ = fVar208 * auVar81._20_4_;
          auVar158._8_4_ = fVar208 * auVar81._24_4_;
          auVar158._12_4_ = fVar208 * auVar81._28_4_;
          auVar70 = vsubps_avx((undefined1  [16])0x0,auVar158);
          auVar72 = vshufpd_avx(auVar165,auVar165,3);
          auVar75 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar55 = vsubps_avx(auVar72,auVar165);
          auVar61 = vsubps_avx(auVar75,(undefined1  [16])0x0);
          auVar192._0_4_ = auVar55._0_4_ + auVar61._0_4_;
          auVar192._4_4_ = auVar55._4_4_ + auVar61._4_4_;
          auVar192._8_4_ = auVar55._8_4_ + auVar61._8_4_;
          auVar192._12_4_ = auVar55._12_4_ + auVar61._12_4_;
          auVar55 = vshufps_avx(auVar165,auVar165,0xb1);
          auVar61 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar62 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar63 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar242._4_4_ = auVar192._0_4_;
          auVar242._0_4_ = auVar192._0_4_;
          auVar242._8_4_ = auVar192._0_4_;
          auVar242._12_4_ = auVar192._0_4_;
          auVar66 = vshufps_avx(auVar192,auVar192,0x55);
          fVar208 = auVar66._0_4_;
          auVar203._0_4_ = auVar55._0_4_ * fVar208;
          fVar217 = auVar66._4_4_;
          auVar203._4_4_ = auVar55._4_4_ * fVar217;
          fVar218 = auVar66._8_4_;
          auVar203._8_4_ = auVar55._8_4_ * fVar218;
          fVar219 = auVar66._12_4_;
          auVar203._12_4_ = auVar55._12_4_ * fVar219;
          auVar210._0_4_ = auVar61._0_4_ * fVar208;
          auVar210._4_4_ = auVar61._4_4_ * fVar217;
          auVar210._8_4_ = auVar61._8_4_ * fVar218;
          auVar210._12_4_ = auVar61._12_4_ * fVar219;
          auVar221._0_4_ = auVar62._0_4_ * fVar208;
          auVar221._4_4_ = auVar62._4_4_ * fVar217;
          auVar221._8_4_ = auVar62._8_4_ * fVar218;
          auVar221._12_4_ = auVar62._12_4_ * fVar219;
          auVar193._0_4_ = auVar63._0_4_ * fVar208;
          auVar193._4_4_ = auVar63._4_4_ * fVar217;
          auVar193._8_4_ = auVar63._8_4_ * fVar218;
          auVar193._12_4_ = auVar63._12_4_ * fVar219;
          auVar55 = vfmadd231ps_fma(auVar203,auVar242,auVar165);
          auVar61 = vfmadd231ps_fma(auVar210,auVar242,auVar173);
          auVar68 = vfmadd231ps_fma(auVar221,auVar242,auVar70);
          auVar69 = vfmadd231ps_fma(auVar193,(undefined1  [16])0x0,auVar242);
          auVar66 = vshufpd_avx(auVar55,auVar55,1);
          auVar67 = vshufpd_avx(auVar61,auVar61,1);
          auVar64 = vshufpd_avx512vl(auVar68,auVar68,1);
          auVar65 = vshufpd_avx512vl(auVar69,auVar69,1);
          auVar62 = vminss_avx(auVar55,auVar61);
          auVar55 = vmaxss_avx(auVar61,auVar55);
          auVar63 = vminss_avx(auVar68,auVar69);
          auVar61 = vmaxss_avx(auVar69,auVar68);
          auVar62 = vminss_avx(auVar62,auVar63);
          auVar55 = vmaxss_avx(auVar61,auVar55);
          auVar63 = vminss_avx(auVar66,auVar67);
          auVar61 = vmaxss_avx(auVar67,auVar66);
          auVar66 = vminss_avx512f(auVar64,auVar65);
          auVar67 = vmaxss_avx512f(auVar65,auVar64);
          auVar61 = vmaxss_avx(auVar67,auVar61);
          auVar81._0_16_ = vminss_avx512f(auVar63,auVar66);
          auVar252 = ZEXT1664(auVar81._0_16_);
          fVar217 = auVar61._0_4_;
          fVar208 = auVar55._0_4_;
          if (auVar62._0_4_ < 0.0001) {
            bVar49 = fVar217 == -0.0001;
            bVar46 = NAN(fVar217);
            if (fVar217 <= -0.0001) goto LAB_01a3086c;
            break;
          }
LAB_01a3086c:
          vucomiss_avx512f(auVar81._0_16_);
          bVar49 = fVar217 <= -0.0001;
          bVar47 = -0.0001 < fVar208;
          bVar46 = bVar49;
          if (!bVar49) break;
          uVar15 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar16 = vcmpps_avx512vl(auVar81._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar39 = (uint)uVar15 & (uint)uVar16;
          bVar12 = (uVar39 & 1) == 0;
          bVar49 = bVar47 && bVar12;
          bVar46 = bVar47 && (uVar39 & 1) == 0;
        } while (!bVar47 || !bVar12);
        auVar67 = auVar261._0_16_;
        vcmpss_avx512f(auVar62,auVar67,1);
        uVar15 = vcmpss_avx512f(auVar55,auVar67,1);
        bVar47 = (bool)((byte)uVar15 & 1);
        auVar103._16_16_ = auVar81._16_16_;
        auVar103._0_16_ = auVar262._0_16_;
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * auVar262._0_4_);
        vucomiss_avx512f(auVar102._0_16_);
        bVar46 = (bool)(!bVar49 | bVar46);
        bVar47 = bVar46 == false;
        auVar105._16_16_ = auVar81._16_16_;
        auVar105._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar104._4_28_ = auVar105._4_28_;
        auVar104._0_4_ = (uint)bVar46 * auVar261._0_4_ + (uint)!bVar46 * 0x7f800000;
        auVar66 = auVar104._0_16_;
        auVar107._16_16_ = auVar81._16_16_;
        auVar107._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar106._4_28_ = auVar107._4_28_;
        auVar106._0_4_ = (uint)bVar46 * auVar261._0_4_ + (uint)!bVar46 * -0x800000;
        auVar63 = auVar106._0_16_;
        uVar15 = vcmpss_avx512f(auVar81._0_16_,auVar67,1);
        bVar49 = (bool)((byte)uVar15 & 1);
        auVar109._16_16_ = auVar81._16_16_;
        auVar109._0_16_ = auVar262._0_16_;
        auVar108._4_28_ = auVar109._4_28_;
        auVar108._0_4_ = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * auVar262._0_4_);
        vucomiss_avx512f(auVar108._0_16_);
        if ((bVar46) || (bVar47)) {
          auVar68 = vucomiss_avx512f(auVar62);
          if ((bVar46) || (bVar47)) {
            auVar69 = vxorps_avx512vl(auVar62,auVar256._0_16_);
            auVar62 = vsubss_avx512f(auVar68,auVar62);
            auVar62 = vdivss_avx512f(auVar69,auVar62);
            auVar68 = vsubss_avx512f(ZEXT416(0x3f800000),auVar62);
            auVar62 = vfmadd213ss_avx512f(auVar68,auVar67,auVar62);
            auVar252 = ZEXT1664(auVar62);
          }
          else {
            auVar62 = vxorps_avx512vl(auVar68,auVar68);
            auVar252 = ZEXT1664(auVar62);
            vucomiss_avx512f(auVar62);
            auVar62 = ZEXT416(0x3f800000);
            if ((bVar46) || (bVar47)) {
              auVar252 = ZEXT464(0x7f800000);
              auVar62 = SUB6416(ZEXT464(0xff800000),0);
            }
          }
          auVar66 = vminss_avx512f(auVar66,auVar252._0_16_);
          auVar63 = vmaxss_avx(auVar62,auVar63);
        }
        auVar262 = ZEXT464(0x3f800000);
        uVar15 = vcmpss_avx512f(auVar61,auVar67,1);
        bVar49 = (bool)((byte)uVar15 & 1);
        auVar61 = auVar262._0_16_;
        fVar218 = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * 0x3f800000);
        if ((auVar102._0_4_ != fVar218) || (NAN(auVar102._0_4_) || NAN(fVar218))) {
          if ((fVar217 != fVar208) || (NAN(fVar217) || NAN(fVar208))) {
            auVar55 = vxorps_avx512vl(auVar55,auVar256._0_16_);
            auVar194._0_4_ = auVar55._0_4_ / (fVar217 - fVar208);
            auVar194._4_12_ = auVar55._4_12_;
            auVar55 = vsubss_avx512f(auVar61,auVar194);
            auVar55 = vfmadd213ss_avx512f(auVar55,auVar67,auVar194);
            auVar62 = auVar55;
          }
          else if ((fVar208 != 0.0) ||
                  (auVar55 = auVar61, auVar62 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar208))) {
            auVar55 = SUB6416(ZEXT464(0xff800000),0);
            auVar62 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar66 = vminss_avx(auVar66,auVar62);
          auVar63 = vmaxss_avx(auVar55,auVar63);
        }
        bVar49 = auVar108._0_4_ != fVar218;
        auVar55 = vminss_avx512f(auVar66,auVar61);
        auVar111._16_16_ = auVar81._16_16_;
        auVar111._0_16_ = auVar66;
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (uint)bVar49 * auVar55._0_4_ + (uint)!bVar49 * auVar66._0_4_;
        auVar55 = vmaxss_avx512f(auVar61,auVar63);
        auVar113._16_16_ = auVar81._16_16_;
        auVar113._0_16_ = auVar63;
        auVar112._4_28_ = auVar113._4_28_;
        auVar112._0_4_ = (uint)bVar49 * auVar55._0_4_ + (uint)!bVar49 * auVar63._0_4_;
        auVar55 = vmaxss_avx512f(auVar67,auVar110._0_16_);
        auVar81._0_16_ = vminss_avx512f(auVar112._0_16_,auVar61);
      } while (auVar81._0_4_ < auVar55._0_4_);
      auVar68 = vmaxss_avx512f(auVar67,ZEXT416((uint)(auVar55._0_4_ + -0.1)));
      auVar69 = vminss_avx512f(ZEXT416((uint)(auVar81._0_4_ + 0.1)),auVar61);
      auVar144._0_8_ = auVar165._0_8_;
      auVar144._8_8_ = auVar144._0_8_;
      auVar211._8_8_ = auVar173._0_8_;
      auVar211._0_8_ = auVar173._0_8_;
      auVar222._8_8_ = auVar70._0_8_;
      auVar222._0_8_ = auVar70._0_8_;
      auVar55 = vshufpd_avx(auVar173,auVar173,3);
      auVar62 = vshufpd_avx(auVar70,auVar70,3);
      auVar63 = vshufps_avx(auVar68,auVar69,0);
      auVar67 = vsubps_avx512vl(auVar136,auVar63);
      fVar208 = auVar63._0_4_;
      auVar168._0_4_ = fVar208 * auVar72._0_4_;
      fVar217 = auVar63._4_4_;
      auVar168._4_4_ = fVar217 * auVar72._4_4_;
      fVar218 = auVar63._8_4_;
      auVar168._8_4_ = fVar218 * auVar72._8_4_;
      fVar219 = auVar63._12_4_;
      auVar168._12_4_ = fVar219 * auVar72._12_4_;
      auVar174._0_4_ = fVar208 * auVar55._0_4_;
      auVar174._4_4_ = fVar217 * auVar55._4_4_;
      auVar174._8_4_ = fVar218 * auVar55._8_4_;
      auVar174._12_4_ = fVar219 * auVar55._12_4_;
      auVar246._0_4_ = auVar62._0_4_ * fVar208;
      auVar246._4_4_ = auVar62._4_4_ * fVar217;
      auVar246._8_4_ = auVar62._8_4_ * fVar218;
      auVar246._12_4_ = auVar62._12_4_ * fVar219;
      auVar159._0_4_ = fVar208 * auVar75._0_4_;
      auVar159._4_4_ = fVar217 * auVar75._4_4_;
      auVar159._8_4_ = fVar218 * auVar75._8_4_;
      auVar159._12_4_ = fVar219 * auVar75._12_4_;
      auVar72 = vfmadd231ps_fma(auVar168,auVar67,auVar144);
      auVar75 = vfmadd231ps_fma(auVar174,auVar67,auVar211);
      auVar66 = vfmadd231ps_fma(auVar246,auVar67,auVar222);
      auVar67 = vfmadd231ps_fma(auVar159,auVar67,ZEXT816(0));
      auVar62 = vsubss_avx512f(auVar61,auVar68);
      auVar55 = vmovshdup_avx(auVar58);
      auVar165 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * auVar68._0_4_)),auVar58,auVar62);
      auVar62 = vsubss_avx512f(auVar61,auVar69);
      auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * auVar69._0_4_)),auVar58,auVar62);
      auVar70 = vdivss_avx512f(auVar61,ZEXT416((uint)fVar119));
      auVar55 = vsubps_avx(auVar75,auVar72);
      auVar177 = auVar253._0_16_;
      auVar62 = vmulps_avx512vl(auVar55,auVar177);
      auVar55 = vsubps_avx(auVar66,auVar75);
      auVar63 = vmulps_avx512vl(auVar55,auVar177);
      auVar55 = vsubps_avx(auVar67,auVar66);
      auVar55 = vmulps_avx512vl(auVar55,auVar177);
      auVar58 = vminps_avx(auVar63,auVar55);
      auVar55 = vmaxps_avx(auVar63,auVar55);
      auVar58 = vminps_avx(auVar62,auVar58);
      auVar55 = vmaxps_avx(auVar62,auVar55);
      auVar62 = vshufpd_avx(auVar58,auVar58,3);
      auVar63 = vshufpd_avx(auVar55,auVar55,3);
      auVar58 = vminps_avx(auVar58,auVar62);
      auVar55 = vmaxps_avx(auVar55,auVar63);
      fVar119 = auVar70._0_4_;
      auVar195._0_4_ = auVar58._0_4_ * fVar119;
      auVar195._4_4_ = auVar58._4_4_ * fVar119;
      auVar195._8_4_ = auVar58._8_4_ * fVar119;
      auVar195._12_4_ = auVar58._12_4_ * fVar119;
      auVar182._0_4_ = fVar119 * auVar55._0_4_;
      auVar182._4_4_ = fVar119 * auVar55._4_4_;
      auVar182._8_4_ = fVar119 * auVar55._8_4_;
      auVar182._12_4_ = fVar119 * auVar55._12_4_;
      auVar70 = vdivss_avx512f(auVar61,ZEXT416((uint)(auVar64._0_4_ - auVar165._0_4_)));
      auVar55 = vshufpd_avx(auVar72,auVar72,3);
      auVar58 = vshufpd_avx(auVar75,auVar75,3);
      auVar62 = vshufpd_avx(auVar66,auVar66,3);
      auVar63 = vshufpd_avx(auVar67,auVar67,3);
      auVar55 = vsubps_avx(auVar55,auVar72);
      auVar72 = vsubps_avx(auVar58,auVar75);
      auVar75 = vsubps_avx(auVar62,auVar66);
      auVar63 = vsubps_avx(auVar63,auVar67);
      auVar58 = vminps_avx(auVar55,auVar72);
      auVar55 = vmaxps_avx(auVar55,auVar72);
      auVar62 = vminps_avx(auVar75,auVar63);
      auVar62 = vminps_avx(auVar58,auVar62);
      auVar58 = vmaxps_avx(auVar75,auVar63);
      auVar55 = vmaxps_avx(auVar55,auVar58);
      fVar119 = auVar70._0_4_;
      auVar223._0_4_ = fVar119 * auVar62._0_4_;
      auVar223._4_4_ = fVar119 * auVar62._4_4_;
      auVar223._8_4_ = fVar119 * auVar62._8_4_;
      auVar223._12_4_ = fVar119 * auVar62._12_4_;
      auVar212._0_4_ = fVar119 * auVar55._0_4_;
      auVar212._4_4_ = fVar119 * auVar55._4_4_;
      auVar212._8_4_ = fVar119 * auVar55._8_4_;
      auVar212._12_4_ = fVar119 * auVar55._12_4_;
      auVar63 = vinsertps_avx(auVar54,auVar165,0x10);
      auVar65 = vpermt2ps_avx512vl(auVar54,_DAT_01fb9f90,auVar64);
      auVar132._0_4_ = auVar63._0_4_ + auVar65._0_4_;
      auVar132._4_4_ = auVar63._4_4_ + auVar65._4_4_;
      auVar132._8_4_ = auVar63._8_4_ + auVar65._8_4_;
      auVar132._12_4_ = auVar63._12_4_ + auVar65._12_4_;
      auVar19._8_4_ = 0x3f000000;
      auVar19._0_8_ = 0x3f0000003f000000;
      auVar19._12_4_ = 0x3f000000;
      auVar70 = vmulps_avx512vl(auVar132,auVar19);
      auVar58 = vshufps_avx(auVar70,auVar70,0x54);
      uVar129 = auVar70._0_4_;
      auVar138._4_4_ = uVar129;
      auVar138._0_4_ = uVar129;
      auVar138._8_4_ = uVar129;
      auVar138._12_4_ = uVar129;
      auVar62 = vfmadd213ps_fma(auVar50,auVar138,auVar5);
      auVar72 = vfmadd213ps_fma(auVar101._0_16_,auVar138,auVar59);
      auVar75 = vfmadd213ps_fma(local_290,auVar138,auVar56);
      auVar55 = vsubps_avx(auVar72,auVar62);
      auVar62 = vfmadd213ps_fma(auVar55,auVar138,auVar62);
      auVar55 = vsubps_avx(auVar75,auVar72);
      auVar55 = vfmadd213ps_fma(auVar55,auVar138,auVar72);
      auVar55 = vsubps_avx(auVar55,auVar62);
      auVar62 = vfmadd231ps_fma(auVar62,auVar55,auVar138);
      auVar66 = vmulps_avx512vl(auVar55,auVar177);
      auVar234._8_8_ = auVar62._0_8_;
      auVar234._0_8_ = auVar62._0_8_;
      auVar55 = vshufpd_avx(auVar62,auVar62,3);
      auVar62 = vshufps_avx(auVar70,auVar70,0x55);
      auVar72 = vsubps_avx(auVar55,auVar234);
      auVar75 = vfmadd231ps_fma(auVar234,auVar62,auVar72);
      auVar247._8_8_ = auVar66._0_8_;
      auVar247._0_8_ = auVar66._0_8_;
      auVar55 = vshufpd_avx(auVar66,auVar66,3);
      auVar55 = vsubps_avx512vl(auVar55,auVar247);
      auVar55 = vfmadd213ps_avx512vl(auVar55,auVar62,auVar247);
      auVar139._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
      auVar139._8_4_ = auVar72._8_4_ ^ 0x80000000;
      auVar139._12_4_ = auVar72._12_4_ ^ 0x80000000;
      auVar62 = vmovshdup_avx512vl(auVar55);
      auVar248._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
      auVar248._8_4_ = auVar62._8_4_ ^ 0x80000000;
      auVar248._12_4_ = auVar62._12_4_ ^ 0x80000000;
      auVar66 = vmovshdup_avx512vl(auVar72);
      auVar67 = vpermt2ps_avx512vl(auVar248,ZEXT416(5),auVar72);
      auVar71 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar261 = ZEXT1664(auVar71);
      auVar62 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar72._0_4_)),auVar55,auVar66);
      auVar72 = vpermt2ps_avx512vl(auVar55,SUB6416(ZEXT464(4),0),auVar139);
      auVar160._0_4_ = auVar62._0_4_;
      auVar160._4_4_ = auVar160._0_4_;
      auVar160._8_4_ = auVar160._0_4_;
      auVar160._12_4_ = auVar160._0_4_;
      auVar55 = vdivps_avx(auVar67,auVar160);
      auVar73 = vdivps_avx512vl(auVar72,auVar160);
      fVar119 = auVar75._0_4_;
      auVar62 = vshufps_avx(auVar75,auVar75,0x55);
      auVar235._0_4_ = fVar119 * auVar55._0_4_ + auVar62._0_4_ * auVar73._0_4_;
      auVar235._4_4_ = fVar119 * auVar55._4_4_ + auVar62._4_4_ * auVar73._4_4_;
      auVar235._8_4_ = fVar119 * auVar55._8_4_ + auVar62._8_4_ * auVar73._8_4_;
      auVar235._12_4_ = fVar119 * auVar55._12_4_ + auVar62._12_4_ * auVar73._12_4_;
      auVar68 = vsubps_avx(auVar58,auVar235);
      auVar62 = vmovshdup_avx(auVar55);
      auVar58 = vinsertps_avx(auVar195,auVar223,0x1c);
      auVar249._0_4_ = auVar62._0_4_ * auVar58._0_4_;
      auVar249._4_4_ = auVar62._4_4_ * auVar58._4_4_;
      auVar249._8_4_ = auVar62._8_4_ * auVar58._8_4_;
      auVar249._12_4_ = auVar62._12_4_ * auVar58._12_4_;
      auVar69 = vinsertps_avx512f(auVar182,auVar212,0x1c);
      auVar62 = vmulps_avx512vl(auVar62,auVar69);
      auVar67 = vminps_avx512vl(auVar249,auVar62);
      auVar75 = vmaxps_avx(auVar62,auVar249);
      auVar66 = vmovshdup_avx(auVar73);
      auVar62 = vinsertps_avx(auVar223,auVar195,0x4c);
      auVar224._0_4_ = auVar66._0_4_ * auVar62._0_4_;
      auVar224._4_4_ = auVar66._4_4_ * auVar62._4_4_;
      auVar224._8_4_ = auVar66._8_4_ * auVar62._8_4_;
      auVar224._12_4_ = auVar66._12_4_ * auVar62._12_4_;
      auVar72 = vinsertps_avx(auVar212,auVar182,0x4c);
      auVar213._0_4_ = auVar66._0_4_ * auVar72._0_4_;
      auVar213._4_4_ = auVar66._4_4_ * auVar72._4_4_;
      auVar213._8_4_ = auVar66._8_4_ * auVar72._8_4_;
      auVar213._12_4_ = auVar66._12_4_ * auVar72._12_4_;
      auVar66 = vminps_avx(auVar224,auVar213);
      auVar67 = vaddps_avx512vl(auVar67,auVar66);
      auVar66 = vmaxps_avx(auVar213,auVar224);
      auVar214._0_4_ = auVar75._0_4_ + auVar66._0_4_;
      auVar214._4_4_ = auVar75._4_4_ + auVar66._4_4_;
      auVar214._8_4_ = auVar75._8_4_ + auVar66._8_4_;
      auVar214._12_4_ = auVar75._12_4_ + auVar66._12_4_;
      auVar225._8_8_ = 0x3f80000000000000;
      auVar225._0_8_ = 0x3f80000000000000;
      auVar75 = vsubps_avx(auVar225,auVar214);
      auVar66 = vsubps_avx(auVar225,auVar67);
      auVar67 = vsubps_avx(auVar63,auVar70);
      auVar70 = vsubps_avx(auVar65,auVar70);
      fVar219 = auVar67._0_4_;
      auVar250._0_4_ = fVar219 * auVar75._0_4_;
      fVar229 = auVar67._4_4_;
      auVar250._4_4_ = fVar229 * auVar75._4_4_;
      fVar230 = auVar67._8_4_;
      auVar250._8_4_ = fVar230 * auVar75._8_4_;
      fVar231 = auVar67._12_4_;
      auVar250._12_4_ = fVar231 * auVar75._12_4_;
      auVar74 = vbroadcastss_avx512vl(auVar55);
      auVar58 = vmulps_avx512vl(auVar74,auVar58);
      auVar69 = vmulps_avx512vl(auVar74,auVar69);
      auVar74 = vminps_avx512vl(auVar58,auVar69);
      auVar69 = vmaxps_avx512vl(auVar69,auVar58);
      auVar58 = vbroadcastss_avx512vl(auVar73);
      auVar62 = vmulps_avx512vl(auVar58,auVar62);
      auVar58 = vmulps_avx512vl(auVar58,auVar72);
      auVar72 = vminps_avx512vl(auVar62,auVar58);
      auVar72 = vaddps_avx512vl(auVar74,auVar72);
      auVar67 = vmulps_avx512vl(auVar67,auVar66);
      fVar119 = auVar70._0_4_;
      auVar215._0_4_ = fVar119 * auVar75._0_4_;
      fVar208 = auVar70._4_4_;
      auVar215._4_4_ = fVar208 * auVar75._4_4_;
      fVar217 = auVar70._8_4_;
      auVar215._8_4_ = fVar217 * auVar75._8_4_;
      fVar218 = auVar70._12_4_;
      auVar215._12_4_ = fVar218 * auVar75._12_4_;
      auVar226._0_4_ = fVar119 * auVar66._0_4_;
      auVar226._4_4_ = fVar208 * auVar66._4_4_;
      auVar226._8_4_ = fVar217 * auVar66._8_4_;
      auVar226._12_4_ = fVar218 * auVar66._12_4_;
      auVar58 = vmaxps_avx(auVar58,auVar62);
      auVar183._0_4_ = auVar69._0_4_ + auVar58._0_4_;
      auVar183._4_4_ = auVar69._4_4_ + auVar58._4_4_;
      auVar183._8_4_ = auVar69._8_4_ + auVar58._8_4_;
      auVar183._12_4_ = auVar69._12_4_ + auVar58._12_4_;
      auVar196._8_8_ = 0x3f800000;
      auVar196._0_8_ = 0x3f800000;
      auVar58 = vsubps_avx(auVar196,auVar183);
      auVar62 = vsubps_avx512vl(auVar196,auVar72);
      auVar243._0_4_ = fVar219 * auVar58._0_4_;
      auVar243._4_4_ = fVar229 * auVar58._4_4_;
      auVar243._8_4_ = fVar230 * auVar58._8_4_;
      auVar243._12_4_ = fVar231 * auVar58._12_4_;
      auVar236._0_4_ = fVar219 * auVar62._0_4_;
      auVar236._4_4_ = fVar229 * auVar62._4_4_;
      auVar236._8_4_ = fVar230 * auVar62._8_4_;
      auVar236._12_4_ = fVar231 * auVar62._12_4_;
      auVar184._0_4_ = fVar119 * auVar58._0_4_;
      auVar184._4_4_ = fVar208 * auVar58._4_4_;
      auVar184._8_4_ = fVar217 * auVar58._8_4_;
      auVar184._12_4_ = fVar218 * auVar58._12_4_;
      auVar197._0_4_ = fVar119 * auVar62._0_4_;
      auVar197._4_4_ = fVar208 * auVar62._4_4_;
      auVar197._8_4_ = fVar217 * auVar62._8_4_;
      auVar197._12_4_ = fVar218 * auVar62._12_4_;
      auVar58 = vminps_avx(auVar243,auVar236);
      auVar62 = vminps_avx512vl(auVar184,auVar197);
      auVar252 = ZEXT1664(auVar62);
      auVar72 = vminps_avx512vl(auVar58,auVar62);
      auVar58 = vmaxps_avx(auVar236,auVar243);
      auVar62 = vmaxps_avx(auVar197,auVar184);
      auVar62 = vmaxps_avx(auVar62,auVar58);
      auVar75 = vminps_avx512vl(auVar250,auVar67);
      auVar58 = vminps_avx(auVar215,auVar226);
      auVar58 = vminps_avx(auVar75,auVar58);
      auVar58 = vhaddps_avx(auVar72,auVar58);
      auVar81._0_16_ = vmaxps_avx512vl(auVar67,auVar250);
      auVar72 = vmaxps_avx(auVar226,auVar215);
      auVar72 = vmaxps_avx(auVar72,auVar81._0_16_);
      auVar62 = vhaddps_avx(auVar62,auVar72);
      auVar58 = vshufps_avx(auVar58,auVar58,0xe8);
      auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
      auVar185._0_4_ = auVar58._0_4_ + auVar68._0_4_;
      auVar185._4_4_ = auVar58._4_4_ + auVar68._4_4_;
      auVar185._8_4_ = auVar58._8_4_ + auVar68._8_4_;
      auVar185._12_4_ = auVar58._12_4_ + auVar68._12_4_;
      auVar198._0_4_ = auVar62._0_4_ + auVar68._0_4_;
      auVar198._4_4_ = auVar62._4_4_ + auVar68._4_4_;
      auVar198._8_4_ = auVar62._8_4_ + auVar68._8_4_;
      auVar198._12_4_ = auVar62._12_4_ + auVar68._12_4_;
      auVar58 = vmaxps_avx(auVar63,auVar185);
      auVar62 = vminps_avx(auVar198,auVar65);
      uVar2 = vcmpps_avx512vl(auVar62,auVar58,1);
    } while ((uVar2 & 3) != 0);
    uVar2 = vcmpps_avx512vl(auVar198,auVar65,1);
    uVar15 = vcmpps_avx512vl(auVar54,auVar185,1);
    if (((ushort)uVar15 & (ushort)uVar2 & 1) == 0) {
      bVar38 = 0;
    }
    else {
      auVar58 = vmovshdup_avx(auVar185);
      bVar38 = auVar165._0_4_ < auVar58._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar40 || uVar118 != 0 && !bVar48) | bVar38) == 1) {
      lVar42 = 0xc9;
      do {
        lVar42 = lVar42 + -1;
        if (lVar42 == 0) goto LAB_01a3063a;
        auVar54 = vsubss_avx512f(auVar61,auVar68);
        fVar217 = auVar54._0_4_;
        fVar119 = fVar217 * fVar217 * fVar217;
        fVar218 = auVar68._0_4_;
        fVar208 = fVar218 * 3.0 * fVar217 * fVar217;
        fVar217 = fVar217 * fVar218 * fVar218 * 3.0;
        auVar151._4_4_ = fVar119;
        auVar151._0_4_ = fVar119;
        auVar151._8_4_ = fVar119;
        auVar151._12_4_ = fVar119;
        auVar145._4_4_ = fVar208;
        auVar145._0_4_ = fVar208;
        auVar145._8_4_ = fVar208;
        auVar145._12_4_ = fVar208;
        auVar122._4_4_ = fVar217;
        auVar122._0_4_ = fVar217;
        auVar122._8_4_ = fVar217;
        auVar122._12_4_ = fVar217;
        fVar218 = fVar218 * fVar218 * fVar218;
        auVar169._0_4_ = (float)local_2a0._0_4_ * fVar218;
        auVar169._4_4_ = (float)local_2a0._4_4_ * fVar218;
        auVar169._8_4_ = fStack_298 * fVar218;
        auVar169._12_4_ = fStack_294 * fVar218;
        auVar54 = vfmadd231ps_fma(auVar169,auVar56,auVar122);
        auVar54 = vfmadd231ps_fma(auVar54,auVar59,auVar145);
        auVar54 = vfmadd231ps_fma(auVar54,auVar5,auVar151);
        auVar123._8_8_ = auVar54._0_8_;
        auVar123._0_8_ = auVar54._0_8_;
        auVar54 = vshufpd_avx(auVar54,auVar54,3);
        auVar58 = vshufps_avx(auVar68,auVar68,0x55);
        auVar54 = vsubps_avx(auVar54,auVar123);
        auVar58 = vfmadd213ps_fma(auVar54,auVar58,auVar123);
        fVar119 = auVar58._0_4_;
        auVar54 = vshufps_avx(auVar58,auVar58,0x55);
        auVar124._0_4_ = auVar55._0_4_ * fVar119 + auVar73._0_4_ * auVar54._0_4_;
        auVar124._4_4_ = auVar55._4_4_ * fVar119 + auVar73._4_4_ * auVar54._4_4_;
        auVar124._8_4_ = auVar55._8_4_ * fVar119 + auVar73._8_4_ * auVar54._8_4_;
        auVar124._12_4_ = auVar55._12_4_ * fVar119 + auVar73._12_4_ * auVar54._12_4_;
        auVar68 = vsubps_avx(auVar68,auVar124);
        auVar54 = vandps_avx512vl(auVar58,auVar255._0_16_);
        auVar81._0_16_ = vprolq_avx512vl(auVar54,0x20);
        auVar54 = vmaxss_avx(auVar81._0_16_,auVar54);
        bVar48 = auVar54._0_4_ <= (float)local_2b0._0_4_;
      } while ((float)local_2b0._0_4_ <= auVar54._0_4_);
      auVar54 = vucomiss_avx512f(auVar71);
      if (bVar48) {
        auVar55 = vucomiss_avx512f(auVar54);
        auVar262 = ZEXT1664(auVar55);
        if (bVar48) {
          vmovshdup_avx(auVar54);
          auVar55 = vucomiss_avx512f(auVar71);
          if (bVar48) {
            auVar58 = vucomiss_avx512f(auVar55);
            auVar262 = ZEXT1664(auVar58);
            if (bVar48) {
              auVar61 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar70 = vinsertps_avx(auVar61,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar61 = vdpps_avx(auVar70,local_2c0,0x7f);
              auVar62 = vdpps_avx(auVar70,local_2d0,0x7f);
              auVar63 = vdpps_avx(auVar70,local_2e0,0x7f);
              auVar72 = vdpps_avx(auVar70,local_2f0,0x7f);
              auVar75 = vdpps_avx(auVar70,local_300,0x7f);
              auVar66 = vdpps_avx(auVar70,local_310,0x7f);
              auVar67 = vdpps_avx(auVar70,local_320,0x7f);
              auVar70 = vdpps_avx(auVar70,local_330,0x7f);
              auVar68 = vsubss_avx512f(auVar58,auVar55);
              fVar218 = auVar55._0_4_;
              auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar75._0_4_)),auVar68,auVar61);
              auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar218)),auVar68,auVar62);
              auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar218)),auVar68,auVar63);
              auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar70._0_4_)),auVar68,auVar72);
              auVar81._0_16_ = vsubss_avx512f(auVar58,auVar54);
              auVar175._0_4_ = auVar81._0_4_;
              fVar119 = auVar175._0_4_ * auVar175._0_4_ * auVar175._0_4_;
              local_120 = auVar54._0_4_;
              fVar208 = local_120 * 3.0 * auVar175._0_4_ * auVar175._0_4_;
              fVar217 = auVar175._0_4_ * local_120 * local_120 * 3.0;
              fVar229 = local_120 * local_120 * local_120;
              auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar63._0_4_)),
                                        ZEXT416((uint)fVar217),auVar62);
              auVar58 = vfmadd231ss_fma(auVar58,ZEXT416((uint)fVar208),auVar61);
              auVar55 = vfmadd231ss_fma(auVar58,ZEXT416((uint)fVar119),auVar55);
              fVar219 = auVar55._0_4_;
              if ((fVar1 <= fVar219) &&
                 (fVar230 = *(float *)(ray + k * 4 + 0x100), fVar219 <= fVar230)) {
                auVar55 = vshufps_avx(auVar54,auVar54,0x55);
                auVar61 = vsubps_avx512vl(auVar136,auVar55);
                fVar231 = auVar55._0_4_;
                auVar204._0_4_ = fVar231 * (float)local_350._0_4_;
                fVar232 = auVar55._4_4_;
                auVar204._4_4_ = fVar232 * (float)local_350._4_4_;
                fVar238 = auVar55._8_4_;
                auVar204._8_4_ = fVar238 * fStack_348;
                fVar239 = auVar55._12_4_;
                auVar204._12_4_ = fVar239 * fStack_344;
                auVar216._0_4_ = fVar231 * (float)local_3a0._0_4_;
                auVar216._4_4_ = fVar232 * (float)local_3a0._4_4_;
                auVar216._8_4_ = fVar238 * fStack_398;
                auVar216._12_4_ = fVar239 * fStack_394;
                auVar227._0_4_ = fVar231 * (float)local_3b0._0_4_;
                auVar227._4_4_ = fVar232 * (float)local_3b0._4_4_;
                auVar227._8_4_ = fVar238 * fStack_3a8;
                auVar227._12_4_ = fVar239 * fStack_3a4;
                auVar186._0_4_ = fVar231 * (float)local_370._0_4_;
                auVar186._4_4_ = fVar232 * (float)local_370._4_4_;
                auVar186._8_4_ = fVar238 * fStack_368;
                auVar186._12_4_ = fVar239 * fStack_364;
                auVar55 = vfmadd231ps_fma(auVar204,auVar61,local_340);
                auVar58 = vfmadd231ps_fma(auVar216,auVar61,local_380);
                auVar136 = vfmadd231ps_fma(auVar227,auVar61,local_390);
                auVar61 = vfmadd231ps_fma(auVar186,auVar61,local_360);
                auVar55 = vsubps_avx(auVar58,auVar55);
                auVar58 = vsubps_avx(auVar136,auVar58);
                auVar136 = vsubps_avx(auVar61,auVar136);
                auVar228._0_4_ = local_120 * auVar58._0_4_;
                auVar228._4_4_ = local_120 * auVar58._4_4_;
                auVar228._8_4_ = local_120 * auVar58._8_4_;
                auVar228._12_4_ = local_120 * auVar58._12_4_;
                auVar175._4_4_ = auVar175._0_4_;
                auVar175._8_4_ = auVar175._0_4_;
                auVar175._12_4_ = auVar175._0_4_;
                auVar55 = vfmadd231ps_fma(auVar228,auVar175,auVar55);
                auVar187._0_4_ = local_120 * auVar136._0_4_;
                auVar187._4_4_ = local_120 * auVar136._4_4_;
                auVar187._8_4_ = local_120 * auVar136._8_4_;
                auVar187._12_4_ = local_120 * auVar136._12_4_;
                auVar58 = vfmadd231ps_fma(auVar187,auVar175,auVar58);
                auVar188._0_4_ = local_120 * auVar58._0_4_;
                auVar188._4_4_ = local_120 * auVar58._4_4_;
                auVar188._8_4_ = local_120 * auVar58._8_4_;
                auVar188._12_4_ = local_120 * auVar58._12_4_;
                auVar55 = vfmadd231ps_fma(auVar188,auVar175,auVar55);
                auVar81._0_16_ = vmulps_avx512vl(auVar55,auVar177);
                pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar170._0_4_ = fVar229 * (float)local_3f0._0_4_;
                  auVar170._4_4_ = fVar229 * (float)local_3f0._4_4_;
                  auVar170._8_4_ = fVar229 * fStack_3e8;
                  auVar170._12_4_ = fVar229 * fStack_3e4;
                  auVar161._4_4_ = fVar217;
                  auVar161._0_4_ = fVar217;
                  auVar161._8_4_ = fVar217;
                  auVar161._12_4_ = fVar217;
                  auVar55 = vfmadd132ps_fma(auVar161,auVar170,local_3e0);
                  auVar152._4_4_ = fVar208;
                  auVar152._0_4_ = fVar208;
                  auVar152._8_4_ = fVar208;
                  auVar152._12_4_ = fVar208;
                  auVar55 = vfmadd132ps_fma(auVar152,auVar55,local_3d0);
                  auVar146._4_4_ = fVar119;
                  auVar146._0_4_ = fVar119;
                  auVar146._8_4_ = fVar119;
                  auVar146._12_4_ = fVar119;
                  auVar136 = vfmadd132ps_fma(auVar146,auVar55,local_3c0);
                  auVar55 = vshufps_avx(auVar136,auVar136,0xc9);
                  auVar58 = vshufps_avx(auVar81._0_16_,auVar81._0_16_,0xc9);
                  auVar147._0_4_ = auVar136._0_4_ * auVar58._0_4_;
                  auVar147._4_4_ = auVar136._4_4_ * auVar58._4_4_;
                  auVar147._8_4_ = auVar136._8_4_ * auVar58._8_4_;
                  auVar147._12_4_ = auVar136._12_4_ * auVar58._12_4_;
                  auVar55 = vfmsub231ps_fma(auVar147,auVar81._0_16_,auVar55);
                  local_140 = auVar55._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar219;
                    uVar129 = vextractps_avx(auVar55,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar129;
                    uVar129 = vextractps_avx(auVar55,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar129;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar218;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_01a3063a;
                  }
                  auVar155._8_4_ = 1;
                  auVar155._0_8_ = 0x100000001;
                  auVar155._12_4_ = 1;
                  auVar155._16_4_ = 1;
                  auVar155._20_4_ = 1;
                  auVar155._24_4_ = 1;
                  auVar155._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar155,ZEXT1632(auVar54));
                  auVar80 = vpermps_avx2(auVar155,ZEXT1632(auVar55));
                  auVar81 = vpermps_avx512vl(auVar260._0_32_,ZEXT1632(auVar55));
                  local_180[0] = (RTCHitN)auVar80[0];
                  local_180[1] = (RTCHitN)auVar80[1];
                  local_180[2] = (RTCHitN)auVar80[2];
                  local_180[3] = (RTCHitN)auVar80[3];
                  local_180[4] = (RTCHitN)auVar80[4];
                  local_180[5] = (RTCHitN)auVar80[5];
                  local_180[6] = (RTCHitN)auVar80[6];
                  local_180[7] = (RTCHitN)auVar80[7];
                  local_180[8] = (RTCHitN)auVar80[8];
                  local_180[9] = (RTCHitN)auVar80[9];
                  local_180[10] = (RTCHitN)auVar80[10];
                  local_180[0xb] = (RTCHitN)auVar80[0xb];
                  local_180[0xc] = (RTCHitN)auVar80[0xc];
                  local_180[0xd] = (RTCHitN)auVar80[0xd];
                  local_180[0xe] = (RTCHitN)auVar80[0xe];
                  local_180[0xf] = (RTCHitN)auVar80[0xf];
                  local_180[0x10] = (RTCHitN)auVar80[0x10];
                  local_180[0x11] = (RTCHitN)auVar80[0x11];
                  local_180[0x12] = (RTCHitN)auVar80[0x12];
                  local_180[0x13] = (RTCHitN)auVar80[0x13];
                  local_180[0x14] = (RTCHitN)auVar80[0x14];
                  local_180[0x15] = (RTCHitN)auVar80[0x15];
                  local_180[0x16] = (RTCHitN)auVar80[0x16];
                  local_180[0x17] = (RTCHitN)auVar80[0x17];
                  local_180[0x18] = (RTCHitN)auVar80[0x18];
                  local_180[0x19] = (RTCHitN)auVar80[0x19];
                  local_180[0x1a] = (RTCHitN)auVar80[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar80[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar80[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar80[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar80[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar80[0x1f];
                  local_160 = auVar81;
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_200._0_8_;
                  uStack_d8 = local_200._8_8_;
                  uStack_d0 = local_200._16_8_;
                  uStack_c8 = local_200._24_8_;
                  local_c0 = local_1e0;
                  vpcmpeqd_avx2(local_1e0,local_1e0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar219;
                  local_420 = local_220;
                  local_460.valid = (int *)local_420;
                  local_460.geometryUserPtr = pGVar8->userPtr;
                  local_460.context = context->user;
                  local_460.hit = local_180;
                  local_460.N = 8;
                  local_460.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_460);
                    auVar54 = vxorps_avx512vl(auVar71,auVar71);
                    auVar261 = ZEXT1664(auVar54);
                    auVar262 = ZEXT464(0x3f800000);
                    auVar259 = ZEXT3264(_DAT_01fb9fe0);
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar258 = ZEXT1664(auVar54);
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar257 = ZEXT1664(auVar54);
                    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar254 = ZEXT3264(auVar81);
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar256 = ZEXT1664(auVar54);
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar255 = ZEXT1664(auVar54);
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar253 = ZEXT1664(auVar54);
                    auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar260 = ZEXT3264(auVar81);
                  }
                  auVar54 = auVar261._0_16_;
                  if (local_420 != (undefined1  [32])0x0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_460);
                      auVar54 = vxorps_avx512vl(auVar54,auVar54);
                      auVar261 = ZEXT1664(auVar54);
                      auVar262 = ZEXT464(0x3f800000);
                      auVar259 = ZEXT3264(_DAT_01fb9fe0);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar258 = ZEXT1664(auVar54);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar257 = ZEXT1664(auVar54);
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar254 = ZEXT3264(auVar81);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar256 = ZEXT1664(auVar54);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar255 = ZEXT1664(auVar54);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar253 = ZEXT1664(auVar54);
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar260 = ZEXT3264(auVar81);
                    }
                    if (local_420 != (undefined1  [32])0x0) {
                      uVar2 = vptestmd_avx512vl(local_420,local_420);
                      iVar31 = *(int *)(local_460.hit + 4);
                      iVar32 = *(int *)(local_460.hit + 8);
                      iVar33 = *(int *)(local_460.hit + 0xc);
                      iVar34 = *(int *)(local_460.hit + 0x10);
                      iVar35 = *(int *)(local_460.hit + 0x14);
                      iVar36 = *(int *)(local_460.hit + 0x18);
                      iVar37 = *(int *)(local_460.hit + 0x1c);
                      bVar38 = (byte)uVar2;
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar49 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar46 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar47 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar14 = SUB81(uVar2 >> 7,0);
                      *(uint *)(local_460.ray + 0x180) =
                           (uint)(bVar38 & 1) * *(int *)local_460.hit |
                           (uint)!(bool)(bVar38 & 1) * *(int *)(local_460.ray + 0x180);
                      *(uint *)(local_460.ray + 0x184) =
                           (uint)bVar48 * iVar31 | (uint)!bVar48 * *(int *)(local_460.ray + 0x184);
                      *(uint *)(local_460.ray + 0x188) =
                           (uint)bVar49 * iVar32 | (uint)!bVar49 * *(int *)(local_460.ray + 0x188);
                      *(uint *)(local_460.ray + 0x18c) =
                           (uint)bVar46 * iVar33 | (uint)!bVar46 * *(int *)(local_460.ray + 0x18c);
                      *(uint *)(local_460.ray + 400) =
                           (uint)bVar47 * iVar34 | (uint)!bVar47 * *(int *)(local_460.ray + 400);
                      *(uint *)(local_460.ray + 0x194) =
                           (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_460.ray + 0x194);
                      *(uint *)(local_460.ray + 0x198) =
                           (uint)bVar13 * iVar36 | (uint)!bVar13 * *(int *)(local_460.ray + 0x198);
                      *(uint *)(local_460.ray + 0x19c) =
                           (uint)bVar14 * iVar37 | (uint)!bVar14 * *(int *)(local_460.ray + 0x19c);
                      iVar31 = *(int *)(local_460.hit + 0x24);
                      iVar32 = *(int *)(local_460.hit + 0x28);
                      iVar33 = *(int *)(local_460.hit + 0x2c);
                      iVar34 = *(int *)(local_460.hit + 0x30);
                      iVar35 = *(int *)(local_460.hit + 0x34);
                      iVar36 = *(int *)(local_460.hit + 0x38);
                      iVar37 = *(int *)(local_460.hit + 0x3c);
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar49 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar46 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar47 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar14 = SUB81(uVar2 >> 7,0);
                      *(uint *)(local_460.ray + 0x1a0) =
                           (uint)(bVar38 & 1) * *(int *)(local_460.hit + 0x20) |
                           (uint)!(bool)(bVar38 & 1) * *(int *)(local_460.ray + 0x1a0);
                      *(uint *)(local_460.ray + 0x1a4) =
                           (uint)bVar48 * iVar31 | (uint)!bVar48 * *(int *)(local_460.ray + 0x1a4);
                      *(uint *)(local_460.ray + 0x1a8) =
                           (uint)bVar49 * iVar32 | (uint)!bVar49 * *(int *)(local_460.ray + 0x1a8);
                      *(uint *)(local_460.ray + 0x1ac) =
                           (uint)bVar46 * iVar33 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1ac);
                      *(uint *)(local_460.ray + 0x1b0) =
                           (uint)bVar47 * iVar34 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1b0);
                      *(uint *)(local_460.ray + 0x1b4) =
                           (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_460.ray + 0x1b4);
                      *(uint *)(local_460.ray + 0x1b8) =
                           (uint)bVar13 * iVar36 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1b8);
                      *(uint *)(local_460.ray + 0x1bc) =
                           (uint)bVar14 * iVar37 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1bc);
                      iVar31 = *(int *)(local_460.hit + 0x44);
                      iVar32 = *(int *)(local_460.hit + 0x48);
                      iVar33 = *(int *)(local_460.hit + 0x4c);
                      iVar34 = *(int *)(local_460.hit + 0x50);
                      iVar35 = *(int *)(local_460.hit + 0x54);
                      iVar36 = *(int *)(local_460.hit + 0x58);
                      iVar37 = *(int *)(local_460.hit + 0x5c);
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar49 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar46 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar47 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar14 = SUB81(uVar2 >> 7,0);
                      *(uint *)(local_460.ray + 0x1c0) =
                           (uint)(bVar38 & 1) * *(int *)(local_460.hit + 0x40) |
                           (uint)!(bool)(bVar38 & 1) * *(int *)(local_460.ray + 0x1c0);
                      *(uint *)(local_460.ray + 0x1c4) =
                           (uint)bVar48 * iVar31 | (uint)!bVar48 * *(int *)(local_460.ray + 0x1c4);
                      *(uint *)(local_460.ray + 0x1c8) =
                           (uint)bVar49 * iVar32 | (uint)!bVar49 * *(int *)(local_460.ray + 0x1c8);
                      *(uint *)(local_460.ray + 0x1cc) =
                           (uint)bVar46 * iVar33 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1cc);
                      *(uint *)(local_460.ray + 0x1d0) =
                           (uint)bVar47 * iVar34 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1d0);
                      *(uint *)(local_460.ray + 0x1d4) =
                           (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_460.ray + 0x1d4);
                      *(uint *)(local_460.ray + 0x1d8) =
                           (uint)bVar13 * iVar36 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1d8);
                      *(uint *)(local_460.ray + 0x1dc) =
                           (uint)bVar14 * iVar37 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1dc);
                      iVar31 = *(int *)(local_460.hit + 100);
                      iVar32 = *(int *)(local_460.hit + 0x68);
                      iVar33 = *(int *)(local_460.hit + 0x6c);
                      iVar34 = *(int *)(local_460.hit + 0x70);
                      iVar35 = *(int *)(local_460.hit + 0x74);
                      iVar36 = *(int *)(local_460.hit + 0x78);
                      iVar37 = *(int *)(local_460.hit + 0x7c);
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar49 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar46 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar47 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar14 = SUB81(uVar2 >> 7,0);
                      *(uint *)(local_460.ray + 0x1e0) =
                           (uint)(bVar38 & 1) * *(int *)(local_460.hit + 0x60) |
                           (uint)!(bool)(bVar38 & 1) * *(int *)(local_460.ray + 0x1e0);
                      *(uint *)(local_460.ray + 0x1e4) =
                           (uint)bVar48 * iVar31 | (uint)!bVar48 * *(int *)(local_460.ray + 0x1e4);
                      *(uint *)(local_460.ray + 0x1e8) =
                           (uint)bVar49 * iVar32 | (uint)!bVar49 * *(int *)(local_460.ray + 0x1e8);
                      *(uint *)(local_460.ray + 0x1ec) =
                           (uint)bVar46 * iVar33 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1ec);
                      *(uint *)(local_460.ray + 0x1f0) =
                           (uint)bVar47 * iVar34 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1f0);
                      *(uint *)(local_460.ray + 500) =
                           (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_460.ray + 500);
                      *(uint *)(local_460.ray + 0x1f8) =
                           (uint)bVar13 * iVar36 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1f8);
                      *(uint *)(local_460.ray + 0x1fc) =
                           (uint)bVar14 * iVar37 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1fc);
                      iVar31 = *(int *)(local_460.ray + 0x204);
                      iVar32 = *(int *)(local_460.ray + 0x208);
                      iVar33 = *(int *)(local_460.ray + 0x20c);
                      iVar34 = *(int *)(local_460.ray + 0x210);
                      iVar35 = *(int *)(local_460.ray + 0x214);
                      iVar36 = *(int *)(local_460.ray + 0x218);
                      iVar37 = *(int *)(local_460.ray + 0x21c);
                      auVar114._0_4_ =
                           (uint)(bVar38 & 1) * *(int *)(local_460.hit + 0x80) |
                           (uint)!(bool)(bVar38 & 1) * *(int *)(local_460.ray + 0x200);
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      auVar114._4_4_ =
                           (uint)bVar48 * *(int *)(local_460.hit + 0x84) | (uint)!bVar48 * iVar31;
                      bVar48 = (bool)((byte)(uVar2 >> 2) & 1);
                      auVar114._8_4_ =
                           (uint)bVar48 * *(int *)(local_460.hit + 0x88) | (uint)!bVar48 * iVar32;
                      bVar48 = (bool)((byte)(uVar2 >> 3) & 1);
                      auVar114._12_4_ =
                           (uint)bVar48 * *(int *)(local_460.hit + 0x8c) | (uint)!bVar48 * iVar33;
                      bVar48 = (bool)((byte)(uVar2 >> 4) & 1);
                      auVar114._16_4_ =
                           (uint)bVar48 * *(int *)(local_460.hit + 0x90) | (uint)!bVar48 * iVar34;
                      bVar48 = (bool)((byte)(uVar2 >> 5) & 1);
                      auVar114._20_4_ =
                           (uint)bVar48 * *(int *)(local_460.hit + 0x94) | (uint)!bVar48 * iVar35;
                      bVar48 = (bool)((byte)(uVar2 >> 6) & 1);
                      auVar114._24_4_ =
                           (uint)bVar48 * *(int *)(local_460.hit + 0x98) | (uint)!bVar48 * iVar36;
                      bVar48 = SUB81(uVar2 >> 7,0);
                      auVar114._28_4_ =
                           (uint)bVar48 * *(int *)(local_460.hit + 0x9c) | (uint)!bVar48 * iVar37;
                      *(undefined1 (*) [32])(local_460.ray + 0x200) = auVar114;
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      uVar118 = bVar48 * auVar114._4_4_ | (uint)!bVar48 * iVar31;
                      auVar27._4_24_ = auVar114._8_24_;
                      auVar27._0_4_ = uVar118;
                      auVar115._0_8_ = auVar27._0_8_ << 0x20;
                      bVar48 = (bool)((byte)(uVar2 >> 2) & 1);
                      auVar115._8_4_ = bVar48 * auVar114._8_4_ | (uint)!bVar48 * iVar32;
                      bVar48 = (bool)((byte)(uVar2 >> 3) & 1);
                      auVar115._12_4_ = bVar48 * auVar114._12_4_ | (uint)!bVar48 * iVar33;
                      bVar48 = (bool)((byte)(uVar2 >> 4) & 1);
                      auVar115._16_4_ = bVar48 * auVar114._16_4_ | (uint)!bVar48 * iVar34;
                      bVar48 = (bool)((byte)(uVar2 >> 5) & 1);
                      auVar115._20_4_ = bVar48 * auVar114._20_4_ | (uint)!bVar48 * iVar35;
                      bVar48 = (bool)((byte)(uVar2 >> 6) & 1);
                      auVar115._24_4_ = bVar48 * auVar114._24_4_ | (uint)!bVar48 * iVar36;
                      bVar48 = SUB81(uVar2 >> 7,0);
                      auVar115._28_4_ = bVar48 * auVar114._28_4_ | (uint)!bVar48 * iVar37;
                      auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xa0));
                      *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar81;
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      uVar118 = bVar48 * uVar118 | (uint)!bVar48 * iVar31;
                      auVar28._4_24_ = auVar115._8_24_;
                      auVar28._0_4_ = uVar118;
                      auVar116._0_8_ = auVar28._0_8_ << 0x20;
                      bVar48 = (bool)((byte)(uVar2 >> 2) & 1);
                      auVar116._8_4_ = bVar48 * auVar115._8_4_ | (uint)!bVar48 * iVar32;
                      bVar48 = (bool)((byte)(uVar2 >> 3) & 1);
                      auVar116._12_4_ = bVar48 * auVar115._12_4_ | (uint)!bVar48 * iVar33;
                      bVar48 = (bool)((byte)(uVar2 >> 4) & 1);
                      auVar116._16_4_ = bVar48 * auVar115._16_4_ | (uint)!bVar48 * iVar34;
                      bVar48 = (bool)((byte)(uVar2 >> 5) & 1);
                      auVar116._20_4_ = bVar48 * auVar115._20_4_ | (uint)!bVar48 * iVar35;
                      bVar48 = (bool)((byte)(uVar2 >> 6) & 1);
                      auVar116._24_4_ = bVar48 * auVar115._24_4_ | (uint)!bVar48 * iVar36;
                      bVar48 = SUB81(uVar2 >> 7,0);
                      auVar116._28_4_ = bVar48 * auVar115._28_4_ | (uint)!bVar48 * iVar37;
                      auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xc0));
                      *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar81;
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      uVar118 = bVar48 * uVar118 | (uint)!bVar48 * iVar31;
                      auVar29._4_24_ = auVar116._8_24_;
                      auVar29._0_4_ = uVar118;
                      auVar117._0_8_ = auVar29._0_8_ << 0x20;
                      bVar48 = (bool)((byte)(uVar2 >> 2) & 1);
                      auVar117._8_4_ = bVar48 * auVar116._8_4_ | (uint)!bVar48 * iVar32;
                      bVar48 = (bool)((byte)(uVar2 >> 3) & 1);
                      auVar117._12_4_ = bVar48 * auVar116._12_4_ | (uint)!bVar48 * iVar33;
                      bVar48 = (bool)((byte)(uVar2 >> 4) & 1);
                      auVar117._16_4_ = bVar48 * auVar116._16_4_ | (uint)!bVar48 * iVar34;
                      bVar48 = (bool)((byte)(uVar2 >> 5) & 1);
                      auVar117._20_4_ = bVar48 * auVar116._20_4_ | (uint)!bVar48 * iVar35;
                      bVar48 = (bool)((byte)(uVar2 >> 6) & 1);
                      auVar117._24_4_ = bVar48 * auVar116._24_4_ | (uint)!bVar48 * iVar36;
                      bVar48 = SUB81(uVar2 >> 7,0);
                      auVar117._28_4_ = bVar48 * auVar116._28_4_ | (uint)!bVar48 * iVar37;
                      auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xe0));
                      *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar81;
                      bVar48 = (bool)((byte)(uVar2 >> 1) & 1);
                      auVar30._4_24_ = auVar117._8_24_;
                      auVar30._0_4_ = bVar48 * uVar118 | (uint)!bVar48 * iVar31;
                      auVar81._0_8_ = auVar30._0_8_ << 0x20;
                      bVar48 = (bool)((byte)(uVar2 >> 2) & 1);
                      auVar81._8_4_ = bVar48 * auVar117._8_4_ | (uint)!bVar48 * iVar32;
                      bVar48 = (bool)((byte)(uVar2 >> 3) & 1);
                      auVar81._12_4_ = bVar48 * auVar117._12_4_ | (uint)!bVar48 * iVar33;
                      bVar48 = (bool)((byte)(uVar2 >> 4) & 1);
                      auVar81._16_4_ = bVar48 * auVar117._16_4_ | (uint)!bVar48 * iVar34;
                      bVar48 = (bool)((byte)(uVar2 >> 5) & 1);
                      auVar81._20_4_ = bVar48 * auVar117._20_4_ | (uint)!bVar48 * iVar35;
                      bVar48 = (bool)((byte)(uVar2 >> 6) & 1);
                      auVar81._24_4_ = bVar48 * auVar117._24_4_ | (uint)!bVar48 * iVar36;
                      bVar48 = SUB81(uVar2 >> 7,0);
                      auVar81._28_4_ = bVar48 * auVar117._28_4_ | (uint)!bVar48 * iVar37;
                      auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0x100));
                      *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar80;
                      goto LAB_01a3063a;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar230;
                }
              }
            }
          }
        }
      }
      goto LAB_01a3063a;
    }
    auVar58 = vinsertps_avx(auVar165,auVar64,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }